

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

int pospopcnt_u16_avx2_blend_popcnt_unroll16(uint16_t *array,uint32_t len,uint32_t *flags)

{
  int *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  undefined1 auVar405 [32];
  undefined1 auVar406 [32];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar421 [32];
  undefined1 auVar422 [32];
  undefined1 auVar423 [32];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar431 [32];
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  undefined1 auVar439 [32];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  undefined1 auVar443 [32];
  undefined1 auVar444 [32];
  undefined1 auVar445 [32];
  undefined1 auVar446 [32];
  undefined1 auVar447 [32];
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [32];
  undefined1 auVar455 [32];
  undefined1 auVar456 [32];
  undefined1 auVar457 [32];
  undefined1 auVar458 [32];
  undefined1 auVar459 [32];
  undefined1 auVar460 [32];
  undefined1 auVar461 [32];
  undefined1 auVar462 [32];
  undefined1 auVar463 [32];
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  undefined1 auVar470 [32];
  undefined1 auVar471 [32];
  undefined1 auVar472 [32];
  undefined1 auVar473 [32];
  undefined1 auVar474 [32];
  undefined1 auVar475 [32];
  undefined1 auVar476 [32];
  undefined1 auVar477 [32];
  undefined1 auVar478 [32];
  undefined1 auVar479 [32];
  undefined1 auVar480 [32];
  undefined1 auVar481 [32];
  undefined1 auVar482 [32];
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  undefined1 auVar486 [32];
  undefined1 auVar487 [32];
  undefined1 auVar488 [32];
  undefined1 auVar489 [32];
  undefined1 auVar490 [32];
  undefined1 auVar491 [32];
  undefined1 auVar492 [32];
  undefined1 auVar493 [32];
  undefined1 auVar494 [32];
  undefined1 auVar495 [32];
  undefined1 auVar496 [32];
  ulong uVar497;
  byte bVar498;
  byte bVar499;
  byte bVar500;
  byte bVar501;
  byte bVar502;
  byte bVar503;
  byte bVar504;
  byte bVar505;
  byte bVar506;
  byte bVar507;
  byte bVar508;
  byte bVar509;
  byte bVar510;
  byte bVar511;
  byte bVar512;
  byte bVar513;
  ulong uVar514;
  ulong uVar515;
  ulong uVar516;
  long lVar517;
  undefined1 auVar518 [32];
  undefined1 auVar519 [32];
  undefined1 auVar520 [32];
  undefined1 auVar521 [32];
  undefined1 auVar522 [32];
  undefined1 auVar523 [32];
  undefined1 auVar524 [32];
  undefined1 auVar525 [32];
  undefined1 auVar526 [32];
  undefined1 auVar527 [32];
  undefined1 auVar528 [32];
  undefined1 auVar529 [32];
  undefined1 auVar530 [32];
  undefined1 auVar531 [32];
  undefined1 auVar532 [32];
  undefined1 auVar533 [32];
  undefined1 auVar534 [32];
  undefined1 auVar535 [32];
  undefined1 auVar536 [32];
  undefined1 auVar537 [64];
  undefined1 auVar538 [64];
  undefined1 auVar539 [64];
  undefined1 auVar540 [64];
  
  uVar497 = (ulong)(len >> 4);
  if (len < 0x100) {
    uVar516 = 0;
  }
  else {
    auVar535 = vmovdqa64_avx512vl(_DAT_0011d0a0);
    auVar536 = vmovdqa64_avx512vl(_DAT_0011d0c0);
    uVar515 = 0;
    uVar514 = 0x10;
    do {
      uVar516 = uVar514;
      auVar518 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xa0));
      auVar519 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xc0));
      auVar520 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xe0));
      lVar517 = 0x20;
      auVar533 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10),auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x10));
      auVar527 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x10),auVar536,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10));
      auVar521 = vmovdqa64_avx512vl(auVar519);
      auVar534 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x20),auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x30));
      auVar525 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x30),auVar536,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x20));
      auVar522 = vmovdqa64_avx512vl(auVar520);
      auVar526 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x40),auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x50));
      auVar528 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x50),auVar536,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x40));
      auVar529 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x60),auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x70));
      auVar530 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x70),auVar536,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x60));
      auVar531 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x80),auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x90));
      auVar532 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x90),auVar536,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0x80));
      auVar523 = vmovdqa64_avx512vl(auVar518);
      auVar523 = vpermt2b_avx512vl(auVar523,auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xb0));
      auVar524 = vpermt2b_avx512vl(auVar521,auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xd0));
      auVar522 = vpermt2b_avx512vl(auVar522,auVar535,
                                   *(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xf0));
      auVar521 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xb0),auVar536,
                                   auVar518);
      auVar518 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xd0),auVar536,
                                   auVar519);
      auVar519 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar515 * 0x10 + 0xf0),auVar536,
                                   auVar520);
      do {
        auVar520 = auVar534 >> 7;
        auVar17 = auVar534 >> 0xf;
        auVar33 = auVar534 >> 0x17;
        auVar49 = auVar534 >> 0x1f;
        auVar65 = auVar534 >> 0x27;
        auVar81 = auVar534 >> 0x2f;
        auVar97 = auVar534 >> 0x37;
        auVar129 = auVar534 >> 0x3f;
        auVar177 = auVar534 >> 0x47;
        auVar225 = auVar534 >> 0x4f;
        auVar273 = auVar534 >> 0x57;
        auVar321 = auVar534 >> 0x5f;
        auVar369 = auVar534 >> 0x67;
        auVar417 = auVar534 >> 0x6f;
        auVar465 = auVar534 >> 0x77;
        auVar113 = auVar534 >> 0x7f;
        auVar137 = auVar534 >> 0x87;
        auVar161 = auVar534 >> 0x8f;
        auVar185 = auVar534 >> 0x97;
        auVar209 = auVar534 >> 0x9f;
        auVar233 = auVar534 >> 0xa7;
        auVar257 = auVar534 >> 0xaf;
        auVar281 = auVar534 >> 0xb7;
        auVar305 = auVar534 >> 0xbf;
        auVar329 = auVar534 >> 199;
        auVar353 = auVar534 >> 0xcf;
        auVar377 = auVar534 >> 0xd7;
        auVar401 = auVar534 >> 0xdf;
        auVar425 = auVar534 >> 0xe7;
        auVar449 = auVar534 >> 0xef;
        auVar473 = auVar534 >> 0xf7;
        bVar498 = auVar534[0x1f];
        auVar2 = auVar526 >> 7;
        auVar18 = auVar526 >> 0xf;
        auVar34 = auVar526 >> 0x17;
        auVar50 = auVar526 >> 0x1f;
        auVar66 = auVar526 >> 0x27;
        auVar82 = auVar526 >> 0x2f;
        auVar98 = auVar526 >> 0x37;
        auVar130 = auVar526 >> 0x3f;
        auVar178 = auVar526 >> 0x47;
        auVar226 = auVar526 >> 0x4f;
        auVar274 = auVar526 >> 0x57;
        auVar322 = auVar526 >> 0x5f;
        auVar370 = auVar526 >> 0x67;
        auVar418 = auVar526 >> 0x6f;
        auVar466 = auVar526 >> 0x77;
        auVar114 = auVar526 >> 0x7f;
        auVar138 = auVar526 >> 0x87;
        auVar162 = auVar526 >> 0x8f;
        auVar186 = auVar526 >> 0x97;
        auVar210 = auVar526 >> 0x9f;
        auVar234 = auVar526 >> 0xa7;
        auVar258 = auVar526 >> 0xaf;
        auVar282 = auVar526 >> 0xb7;
        auVar306 = auVar526 >> 0xbf;
        auVar330 = auVar526 >> 199;
        auVar354 = auVar526 >> 0xcf;
        auVar378 = auVar526 >> 0xd7;
        auVar402 = auVar526 >> 0xdf;
        auVar426 = auVar526 >> 0xe7;
        auVar450 = auVar526 >> 0xef;
        auVar474 = auVar526 >> 0xf7;
        bVar499 = auVar526[0x1f];
        auVar3 = auVar525 >> 7;
        auVar19 = auVar525 >> 0xf;
        auVar35 = auVar525 >> 0x17;
        auVar51 = auVar525 >> 0x1f;
        auVar67 = auVar525 >> 0x27;
        auVar83 = auVar525 >> 0x2f;
        auVar99 = auVar525 >> 0x37;
        auVar131 = auVar525 >> 0x3f;
        auVar179 = auVar525 >> 0x47;
        auVar227 = auVar525 >> 0x4f;
        auVar275 = auVar525 >> 0x57;
        auVar323 = auVar525 >> 0x5f;
        auVar371 = auVar525 >> 0x67;
        auVar419 = auVar525 >> 0x6f;
        auVar467 = auVar525 >> 0x77;
        auVar115 = auVar525 >> 0x7f;
        auVar139 = auVar525 >> 0x87;
        auVar163 = auVar525 >> 0x8f;
        auVar187 = auVar525 >> 0x97;
        auVar211 = auVar525 >> 0x9f;
        auVar235 = auVar525 >> 0xa7;
        auVar259 = auVar525 >> 0xaf;
        auVar283 = auVar525 >> 0xb7;
        auVar307 = auVar525 >> 0xbf;
        auVar331 = auVar525 >> 199;
        auVar355 = auVar525 >> 0xcf;
        auVar379 = auVar525 >> 0xd7;
        auVar403 = auVar525 >> 0xdf;
        auVar427 = auVar525 >> 0xe7;
        auVar451 = auVar525 >> 0xef;
        auVar475 = auVar525 >> 0xf7;
        bVar500 = auVar525[0x1f];
        auVar4 = auVar533 >> 7;
        auVar20 = auVar533 >> 0xf;
        auVar36 = auVar533 >> 0x17;
        auVar52 = auVar533 >> 0x1f;
        auVar68 = auVar533 >> 0x27;
        auVar84 = auVar533 >> 0x2f;
        auVar100 = auVar533 >> 0x37;
        auVar132 = auVar533 >> 0x3f;
        auVar180 = auVar533 >> 0x47;
        auVar228 = auVar533 >> 0x4f;
        auVar276 = auVar533 >> 0x57;
        auVar324 = auVar533 >> 0x5f;
        auVar372 = auVar533 >> 0x67;
        auVar420 = auVar533 >> 0x6f;
        auVar468 = auVar533 >> 0x77;
        auVar116 = auVar533 >> 0x7f;
        auVar140 = auVar533 >> 0x87;
        auVar164 = auVar533 >> 0x8f;
        auVar188 = auVar533 >> 0x97;
        auVar212 = auVar533 >> 0x9f;
        auVar236 = auVar533 >> 0xa7;
        auVar260 = auVar533 >> 0xaf;
        auVar284 = auVar533 >> 0xb7;
        auVar308 = auVar533 >> 0xbf;
        auVar332 = auVar533 >> 199;
        auVar356 = auVar533 >> 0xcf;
        auVar380 = auVar533 >> 0xd7;
        auVar404 = auVar533 >> 0xdf;
        auVar428 = auVar533 >> 0xe7;
        auVar452 = auVar533 >> 0xef;
        auVar476 = auVar533 >> 0xf7;
        bVar501 = auVar533[0x1f];
        auVar533 = vpaddb_avx2(auVar533,auVar533);
        auVar534 = vpaddb_avx2(auVar534,auVar534);
        auVar525 = vpaddb_avx2(auVar525,auVar525);
        auVar526 = vpaddb_avx2(auVar526,auVar526);
        auVar5 = auVar527 >> 7;
        auVar21 = auVar527 >> 0xf;
        auVar37 = auVar527 >> 0x17;
        auVar53 = auVar527 >> 0x1f;
        auVar69 = auVar527 >> 0x27;
        auVar85 = auVar527 >> 0x2f;
        auVar101 = auVar527 >> 0x37;
        auVar133 = auVar527 >> 0x3f;
        auVar181 = auVar527 >> 0x47;
        auVar229 = auVar527 >> 0x4f;
        auVar277 = auVar527 >> 0x57;
        auVar325 = auVar527 >> 0x5f;
        auVar373 = auVar527 >> 0x67;
        auVar421 = auVar527 >> 0x6f;
        auVar469 = auVar527 >> 0x77;
        auVar117 = auVar527 >> 0x7f;
        auVar141 = auVar527 >> 0x87;
        auVar165 = auVar527 >> 0x8f;
        auVar189 = auVar527 >> 0x97;
        auVar213 = auVar527 >> 0x9f;
        auVar237 = auVar527 >> 0xa7;
        auVar261 = auVar527 >> 0xaf;
        auVar285 = auVar527 >> 0xb7;
        auVar309 = auVar527 >> 0xbf;
        auVar333 = auVar527 >> 199;
        auVar357 = auVar527 >> 0xcf;
        auVar381 = auVar527 >> 0xd7;
        auVar405 = auVar527 >> 0xdf;
        auVar429 = auVar527 >> 0xe7;
        auVar453 = auVar527 >> 0xef;
        auVar477 = auVar527 >> 0xf7;
        bVar502 = auVar527[0x1f];
        auVar527 = vpaddb_avx2(auVar527,auVar527);
        auVar6 = auVar528 >> 7;
        auVar22 = auVar528 >> 0xf;
        auVar38 = auVar528 >> 0x17;
        auVar54 = auVar528 >> 0x1f;
        auVar70 = auVar528 >> 0x27;
        auVar86 = auVar528 >> 0x2f;
        auVar102 = auVar528 >> 0x37;
        auVar134 = auVar528 >> 0x3f;
        auVar182 = auVar528 >> 0x47;
        auVar230 = auVar528 >> 0x4f;
        auVar278 = auVar528 >> 0x57;
        auVar326 = auVar528 >> 0x5f;
        auVar374 = auVar528 >> 0x67;
        auVar422 = auVar528 >> 0x6f;
        auVar470 = auVar528 >> 0x77;
        auVar118 = auVar528 >> 0x7f;
        auVar142 = auVar528 >> 0x87;
        auVar166 = auVar528 >> 0x8f;
        auVar190 = auVar528 >> 0x97;
        auVar214 = auVar528 >> 0x9f;
        auVar238 = auVar528 >> 0xa7;
        auVar262 = auVar528 >> 0xaf;
        auVar286 = auVar528 >> 0xb7;
        auVar310 = auVar528 >> 0xbf;
        auVar334 = auVar528 >> 199;
        auVar358 = auVar528 >> 0xcf;
        auVar382 = auVar528 >> 0xd7;
        auVar406 = auVar528 >> 0xdf;
        auVar430 = auVar528 >> 0xe7;
        auVar454 = auVar528 >> 0xef;
        auVar478 = auVar528 >> 0xf7;
        bVar503 = auVar528[0x1f];
        auVar528 = vpaddb_avx2(auVar528,auVar528);
        auVar7 = auVar529 >> 7;
        auVar23 = auVar529 >> 0xf;
        auVar39 = auVar529 >> 0x17;
        auVar55 = auVar529 >> 0x1f;
        auVar71 = auVar529 >> 0x27;
        auVar87 = auVar529 >> 0x2f;
        auVar103 = auVar529 >> 0x37;
        auVar135 = auVar529 >> 0x3f;
        auVar183 = auVar529 >> 0x47;
        auVar231 = auVar529 >> 0x4f;
        auVar279 = auVar529 >> 0x57;
        auVar327 = auVar529 >> 0x5f;
        auVar375 = auVar529 >> 0x67;
        auVar423 = auVar529 >> 0x6f;
        auVar471 = auVar529 >> 0x77;
        auVar119 = auVar529 >> 0x7f;
        auVar143 = auVar529 >> 0x87;
        auVar167 = auVar529 >> 0x8f;
        auVar191 = auVar529 >> 0x97;
        auVar215 = auVar529 >> 0x9f;
        auVar239 = auVar529 >> 0xa7;
        auVar263 = auVar529 >> 0xaf;
        auVar287 = auVar529 >> 0xb7;
        auVar311 = auVar529 >> 0xbf;
        auVar335 = auVar529 >> 199;
        auVar359 = auVar529 >> 0xcf;
        auVar383 = auVar529 >> 0xd7;
        auVar407 = auVar529 >> 0xdf;
        auVar431 = auVar529 >> 0xe7;
        auVar455 = auVar529 >> 0xef;
        auVar479 = auVar529 >> 0xf7;
        bVar504 = auVar529[0x1f];
        auVar529 = vpaddb_avx2(auVar529,auVar529);
        auVar8 = auVar530 >> 7;
        auVar24 = auVar530 >> 0xf;
        auVar40 = auVar530 >> 0x17;
        auVar56 = auVar530 >> 0x1f;
        auVar72 = auVar530 >> 0x27;
        auVar88 = auVar530 >> 0x2f;
        auVar104 = auVar530 >> 0x37;
        auVar136 = auVar530 >> 0x3f;
        auVar184 = auVar530 >> 0x47;
        auVar232 = auVar530 >> 0x4f;
        auVar280 = auVar530 >> 0x57;
        auVar328 = auVar530 >> 0x5f;
        auVar376 = auVar530 >> 0x67;
        auVar424 = auVar530 >> 0x6f;
        auVar472 = auVar530 >> 0x77;
        auVar120 = auVar530 >> 0x7f;
        auVar144 = auVar530 >> 0x87;
        auVar168 = auVar530 >> 0x8f;
        auVar192 = auVar530 >> 0x97;
        auVar216 = auVar530 >> 0x9f;
        auVar240 = auVar530 >> 0xa7;
        auVar264 = auVar530 >> 0xaf;
        auVar288 = auVar530 >> 0xb7;
        auVar312 = auVar530 >> 0xbf;
        auVar336 = auVar530 >> 199;
        auVar360 = auVar530 >> 0xcf;
        auVar384 = auVar530 >> 0xd7;
        auVar408 = auVar530 >> 0xdf;
        auVar432 = auVar530 >> 0xe7;
        auVar456 = auVar530 >> 0xef;
        auVar480 = auVar530 >> 0xf7;
        bVar505 = auVar530[0x1f];
        auVar530 = vpaddb_avx2(auVar530,auVar530);
        auVar9 = auVar531 >> 7;
        auVar25 = auVar531 >> 0xf;
        auVar41 = auVar531 >> 0x17;
        auVar57 = auVar531 >> 0x1f;
        auVar73 = auVar531 >> 0x27;
        auVar89 = auVar531 >> 0x2f;
        auVar105 = auVar531 >> 0x37;
        auVar153 = auVar531 >> 0x3f;
        auVar201 = auVar531 >> 0x47;
        auVar249 = auVar531 >> 0x4f;
        auVar297 = auVar531 >> 0x57;
        auVar345 = auVar531 >> 0x5f;
        auVar393 = auVar531 >> 0x67;
        auVar441 = auVar531 >> 0x6f;
        auVar489 = auVar531 >> 0x77;
        auVar121 = auVar531 >> 0x7f;
        auVar145 = auVar531 >> 0x87;
        auVar169 = auVar531 >> 0x8f;
        auVar193 = auVar531 >> 0x97;
        auVar217 = auVar531 >> 0x9f;
        auVar241 = auVar531 >> 0xa7;
        auVar265 = auVar531 >> 0xaf;
        auVar289 = auVar531 >> 0xb7;
        auVar313 = auVar531 >> 0xbf;
        auVar337 = auVar531 >> 199;
        auVar361 = auVar531 >> 0xcf;
        auVar385 = auVar531 >> 0xd7;
        auVar409 = auVar531 >> 0xdf;
        auVar433 = auVar531 >> 0xe7;
        auVar457 = auVar531 >> 0xef;
        auVar481 = auVar531 >> 0xf7;
        bVar506 = auVar531[0x1f];
        auVar531 = vpaddb_avx2(auVar531,auVar531);
        auVar10 = auVar532 >> 7;
        auVar26 = auVar532 >> 0xf;
        auVar42 = auVar532 >> 0x17;
        auVar58 = auVar532 >> 0x1f;
        auVar74 = auVar532 >> 0x27;
        auVar90 = auVar532 >> 0x2f;
        auVar106 = auVar532 >> 0x37;
        auVar154 = auVar532 >> 0x3f;
        auVar202 = auVar532 >> 0x47;
        auVar250 = auVar532 >> 0x4f;
        auVar298 = auVar532 >> 0x57;
        auVar346 = auVar532 >> 0x5f;
        auVar394 = auVar532 >> 0x67;
        auVar442 = auVar532 >> 0x6f;
        auVar490 = auVar532 >> 0x77;
        auVar122 = auVar532 >> 0x7f;
        auVar146 = auVar532 >> 0x87;
        auVar170 = auVar532 >> 0x8f;
        auVar194 = auVar532 >> 0x97;
        auVar218 = auVar532 >> 0x9f;
        auVar242 = auVar532 >> 0xa7;
        auVar266 = auVar532 >> 0xaf;
        auVar290 = auVar532 >> 0xb7;
        auVar314 = auVar532 >> 0xbf;
        auVar338 = auVar532 >> 199;
        auVar362 = auVar532 >> 0xcf;
        auVar386 = auVar532 >> 0xd7;
        auVar410 = auVar532 >> 0xdf;
        auVar434 = auVar532 >> 0xe7;
        auVar458 = auVar532 >> 0xef;
        auVar482 = auVar532 >> 0xf7;
        bVar507 = auVar532[0x1f];
        auVar532 = vpaddb_avx2(auVar532,auVar532);
        auVar11 = auVar523 >> 7;
        auVar27 = auVar523 >> 0xf;
        auVar43 = auVar523 >> 0x17;
        auVar59 = auVar523 >> 0x1f;
        auVar75 = auVar523 >> 0x27;
        auVar91 = auVar523 >> 0x2f;
        auVar107 = auVar523 >> 0x37;
        auVar155 = auVar523 >> 0x3f;
        auVar203 = auVar523 >> 0x47;
        auVar251 = auVar523 >> 0x4f;
        auVar299 = auVar523 >> 0x57;
        auVar347 = auVar523 >> 0x5f;
        auVar395 = auVar523 >> 0x67;
        auVar443 = auVar523 >> 0x6f;
        auVar491 = auVar523 >> 0x77;
        auVar123 = auVar523 >> 0x7f;
        auVar147 = auVar523 >> 0x87;
        auVar171 = auVar523 >> 0x8f;
        auVar195 = auVar523 >> 0x97;
        auVar219 = auVar523 >> 0x9f;
        auVar243 = auVar523 >> 0xa7;
        auVar267 = auVar523 >> 0xaf;
        auVar291 = auVar523 >> 0xb7;
        auVar315 = auVar523 >> 0xbf;
        auVar339 = auVar523 >> 199;
        auVar363 = auVar523 >> 0xcf;
        auVar387 = auVar523 >> 0xd7;
        auVar411 = auVar523 >> 0xdf;
        auVar435 = auVar523 >> 0xe7;
        auVar459 = auVar523 >> 0xef;
        auVar483 = auVar523 >> 0xf7;
        bVar508 = auVar523[0x1f];
        auVar523 = vpaddb_avx2(auVar523,auVar523);
        auVar12 = auVar518 >> 7;
        auVar28 = auVar518 >> 0xf;
        auVar44 = auVar518 >> 0x17;
        auVar60 = auVar518 >> 0x1f;
        auVar76 = auVar518 >> 0x27;
        auVar92 = auVar518 >> 0x2f;
        auVar108 = auVar518 >> 0x37;
        auVar156 = auVar518 >> 0x3f;
        auVar204 = auVar518 >> 0x47;
        auVar252 = auVar518 >> 0x4f;
        auVar300 = auVar518 >> 0x57;
        auVar348 = auVar518 >> 0x5f;
        auVar396 = auVar518 >> 0x67;
        auVar444 = auVar518 >> 0x6f;
        auVar492 = auVar518 >> 0x77;
        auVar124 = auVar518 >> 0x7f;
        auVar148 = auVar518 >> 0x87;
        auVar172 = auVar518 >> 0x8f;
        auVar196 = auVar518 >> 0x97;
        auVar220 = auVar518 >> 0x9f;
        auVar244 = auVar518 >> 0xa7;
        auVar268 = auVar518 >> 0xaf;
        auVar292 = auVar518 >> 0xb7;
        auVar316 = auVar518 >> 0xbf;
        auVar340 = auVar518 >> 199;
        auVar364 = auVar518 >> 0xcf;
        auVar388 = auVar518 >> 0xd7;
        auVar412 = auVar518 >> 0xdf;
        auVar436 = auVar518 >> 0xe7;
        auVar460 = auVar518 >> 0xef;
        auVar484 = auVar518 >> 0xf7;
        bVar509 = auVar518[0x1f];
        auVar518 = vpaddb_avx2(auVar518,auVar518);
        auVar13 = auVar521 >> 7;
        auVar29 = auVar521 >> 0xf;
        auVar45 = auVar521 >> 0x17;
        auVar61 = auVar521 >> 0x1f;
        auVar77 = auVar521 >> 0x27;
        auVar93 = auVar521 >> 0x2f;
        auVar109 = auVar521 >> 0x37;
        auVar157 = auVar521 >> 0x3f;
        auVar205 = auVar521 >> 0x47;
        auVar253 = auVar521 >> 0x4f;
        auVar301 = auVar521 >> 0x57;
        auVar349 = auVar521 >> 0x5f;
        auVar397 = auVar521 >> 0x67;
        auVar445 = auVar521 >> 0x6f;
        auVar493 = auVar521 >> 0x77;
        auVar125 = auVar521 >> 0x7f;
        auVar149 = auVar521 >> 0x87;
        auVar173 = auVar521 >> 0x8f;
        auVar197 = auVar521 >> 0x97;
        auVar221 = auVar521 >> 0x9f;
        auVar245 = auVar521 >> 0xa7;
        auVar269 = auVar521 >> 0xaf;
        auVar293 = auVar521 >> 0xb7;
        auVar317 = auVar521 >> 0xbf;
        auVar341 = auVar521 >> 199;
        auVar365 = auVar521 >> 0xcf;
        auVar389 = auVar521 >> 0xd7;
        auVar413 = auVar521 >> 0xdf;
        auVar437 = auVar521 >> 0xe7;
        auVar461 = auVar521 >> 0xef;
        auVar485 = auVar521 >> 0xf7;
        bVar510 = auVar521[0x1f];
        auVar521 = vpaddb_avx2(auVar521,auVar521);
        auVar14 = auVar522 >> 7;
        auVar30 = auVar522 >> 0xf;
        auVar46 = auVar522 >> 0x17;
        auVar62 = auVar522 >> 0x1f;
        auVar78 = auVar522 >> 0x27;
        auVar94 = auVar522 >> 0x2f;
        auVar110 = auVar522 >> 0x37;
        auVar158 = auVar522 >> 0x3f;
        auVar206 = auVar522 >> 0x47;
        auVar254 = auVar522 >> 0x4f;
        auVar302 = auVar522 >> 0x57;
        auVar350 = auVar522 >> 0x5f;
        auVar398 = auVar522 >> 0x67;
        auVar446 = auVar522 >> 0x6f;
        auVar494 = auVar522 >> 0x77;
        auVar126 = auVar522 >> 0x7f;
        auVar150 = auVar522 >> 0x87;
        auVar174 = auVar522 >> 0x8f;
        auVar198 = auVar522 >> 0x97;
        auVar222 = auVar522 >> 0x9f;
        auVar246 = auVar522 >> 0xa7;
        auVar270 = auVar522 >> 0xaf;
        auVar294 = auVar522 >> 0xb7;
        auVar318 = auVar522 >> 0xbf;
        auVar342 = auVar522 >> 199;
        auVar366 = auVar522 >> 0xcf;
        auVar390 = auVar522 >> 0xd7;
        auVar414 = auVar522 >> 0xdf;
        auVar438 = auVar522 >> 0xe7;
        auVar462 = auVar522 >> 0xef;
        auVar486 = auVar522 >> 0xf7;
        bVar511 = auVar522[0x1f];
        auVar522 = vpaddb_avx2(auVar522,auVar522);
        auVar15 = auVar524 >> 7;
        auVar31 = auVar524 >> 0xf;
        auVar47 = auVar524 >> 0x17;
        auVar63 = auVar524 >> 0x1f;
        auVar79 = auVar524 >> 0x27;
        auVar95 = auVar524 >> 0x2f;
        auVar111 = auVar524 >> 0x37;
        auVar159 = auVar524 >> 0x3f;
        auVar207 = auVar524 >> 0x47;
        auVar255 = auVar524 >> 0x4f;
        auVar303 = auVar524 >> 0x57;
        auVar351 = auVar524 >> 0x5f;
        auVar399 = auVar524 >> 0x67;
        auVar447 = auVar524 >> 0x6f;
        auVar495 = auVar524 >> 0x77;
        auVar127 = auVar524 >> 0x7f;
        auVar151 = auVar524 >> 0x87;
        auVar175 = auVar524 >> 0x8f;
        auVar199 = auVar524 >> 0x97;
        auVar223 = auVar524 >> 0x9f;
        auVar247 = auVar524 >> 0xa7;
        auVar271 = auVar524 >> 0xaf;
        auVar295 = auVar524 >> 0xb7;
        auVar319 = auVar524 >> 0xbf;
        auVar343 = auVar524 >> 199;
        auVar367 = auVar524 >> 0xcf;
        auVar391 = auVar524 >> 0xd7;
        auVar415 = auVar524 >> 0xdf;
        auVar439 = auVar524 >> 0xe7;
        auVar463 = auVar524 >> 0xef;
        auVar487 = auVar524 >> 0xf7;
        bVar512 = auVar524[0x1f];
        auVar524 = vpaddb_avx2(auVar524,auVar524);
        auVar16 = auVar519 >> 7;
        auVar32 = auVar519 >> 0xf;
        auVar48 = auVar519 >> 0x17;
        auVar64 = auVar519 >> 0x1f;
        auVar80 = auVar519 >> 0x27;
        auVar96 = auVar519 >> 0x2f;
        auVar112 = auVar519 >> 0x37;
        auVar160 = auVar519 >> 0x3f;
        auVar208 = auVar519 >> 0x47;
        auVar256 = auVar519 >> 0x4f;
        auVar304 = auVar519 >> 0x57;
        auVar352 = auVar519 >> 0x5f;
        auVar400 = auVar519 >> 0x67;
        auVar448 = auVar519 >> 0x6f;
        auVar496 = auVar519 >> 0x77;
        auVar128 = auVar519 >> 0x7f;
        auVar152 = auVar519 >> 0x87;
        auVar176 = auVar519 >> 0x8f;
        auVar200 = auVar519 >> 0x97;
        auVar224 = auVar519 >> 0x9f;
        auVar248 = auVar519 >> 0xa7;
        auVar272 = auVar519 >> 0xaf;
        auVar296 = auVar519 >> 0xb7;
        auVar320 = auVar519 >> 0xbf;
        auVar344 = auVar519 >> 199;
        auVar368 = auVar519 >> 0xcf;
        auVar392 = auVar519 >> 0xd7;
        auVar416 = auVar519 >> 0xdf;
        auVar440 = auVar519 >> 0xe7;
        auVar464 = auVar519 >> 0xef;
        auVar488 = auVar519 >> 0xf7;
        bVar513 = auVar519[0x1f];
        auVar519 = vpaddb_avx2(auVar519,auVar519);
        *(int *)((long)flags + lVar517 + -4) =
             POPCOUNT((uint)(auVar14[0] & 1) | (uint)(auVar30[0] & 1) << 1 |
                      (uint)(auVar46[0] & 1) << 2 | (uint)(auVar62[0] & 1) << 3 |
                      (uint)(auVar78[0] & 1) << 4 | (uint)(auVar94[0] & 1) << 5 |
                      (uint)(auVar110[0] & 1) << 6 | (uint)(auVar158[0] & 1) << 7 |
                      (uint)(auVar206[0] & 1) << 8 | (uint)(auVar254[0] & 1) << 9 |
                      (uint)(auVar302[0] & 1) << 10 | (uint)(auVar350[0] & 1) << 0xb |
                      (uint)(auVar398[0] & 1) << 0xc | (uint)(auVar446[0] & 1) << 0xd |
                      (uint)(auVar494[0] & 1) << 0xe | (uint)auVar126[0] << 0xf |
                      (uint)(auVar150[0] & 1) << 0x10 | (uint)(auVar174[0] & 1) << 0x11 |
                      (uint)(auVar198[0] & 1) << 0x12 | (uint)(auVar222[0] & 1) << 0x13 |
                      (uint)(auVar246[0] & 1) << 0x14 | (uint)(auVar270[0] & 1) << 0x15 |
                      (uint)(auVar294[0] & 1) << 0x16 | (uint)auVar318[0] << 0x17 |
                      (uint)(auVar342[0] & 1) << 0x18 | (uint)(auVar366[0] & 1) << 0x19 |
                      (uint)(auVar390[0] & 1) << 0x1a | (uint)(auVar414[0] & 1) << 0x1b |
                      (uint)(auVar438[0] & 1) << 0x1c | (uint)(auVar462[0] & 1) << 0x1d |
                      (uint)(auVar486[0] & 1) << 0x1e | (uint)(bVar511 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar15[0] & 1) | (uint)(auVar31[0] & 1) << 1 |
                      (uint)(auVar47[0] & 1) << 2 | (uint)(auVar63[0] & 1) << 3 |
                      (uint)(auVar79[0] & 1) << 4 | (uint)(auVar95[0] & 1) << 5 |
                      (uint)(auVar111[0] & 1) << 6 | (uint)(auVar159[0] & 1) << 7 |
                      (uint)(auVar207[0] & 1) << 8 | (uint)(auVar255[0] & 1) << 9 |
                      (uint)(auVar303[0] & 1) << 10 | (uint)(auVar351[0] & 1) << 0xb |
                      (uint)(auVar399[0] & 1) << 0xc | (uint)(auVar447[0] & 1) << 0xd |
                      (uint)(auVar495[0] & 1) << 0xe | (uint)auVar127[0] << 0xf |
                      (uint)(auVar151[0] & 1) << 0x10 | (uint)(auVar175[0] & 1) << 0x11 |
                      (uint)(auVar199[0] & 1) << 0x12 | (uint)(auVar223[0] & 1) << 0x13 |
                      (uint)(auVar247[0] & 1) << 0x14 | (uint)(auVar271[0] & 1) << 0x15 |
                      (uint)(auVar295[0] & 1) << 0x16 | (uint)auVar319[0] << 0x17 |
                      (uint)(auVar343[0] & 1) << 0x18 | (uint)(auVar367[0] & 1) << 0x19 |
                      (uint)(auVar391[0] & 1) << 0x1a | (uint)(auVar415[0] & 1) << 0x1b |
                      (uint)(auVar439[0] & 1) << 0x1c | (uint)(auVar463[0] & 1) << 0x1d |
                      (uint)(auVar487[0] & 1) << 0x1e | (uint)(bVar512 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar11[0] & 1) | (uint)(auVar27[0] & 1) << 1 |
                      (uint)(auVar43[0] & 1) << 2 | (uint)(auVar59[0] & 1) << 3 |
                      (uint)(auVar75[0] & 1) << 4 | (uint)(auVar91[0] & 1) << 5 |
                      (uint)(auVar107[0] & 1) << 6 | (uint)(auVar155[0] & 1) << 7 |
                      (uint)(auVar203[0] & 1) << 8 | (uint)(auVar251[0] & 1) << 9 |
                      (uint)(auVar299[0] & 1) << 10 | (uint)(auVar347[0] & 1) << 0xb |
                      (uint)(auVar395[0] & 1) << 0xc | (uint)(auVar443[0] & 1) << 0xd |
                      (uint)(auVar491[0] & 1) << 0xe | (uint)auVar123[0] << 0xf |
                      (uint)(auVar147[0] & 1) << 0x10 | (uint)(auVar171[0] & 1) << 0x11 |
                      (uint)(auVar195[0] & 1) << 0x12 | (uint)(auVar219[0] & 1) << 0x13 |
                      (uint)(auVar243[0] & 1) << 0x14 | (uint)(auVar267[0] & 1) << 0x15 |
                      (uint)(auVar291[0] & 1) << 0x16 | (uint)auVar315[0] << 0x17 |
                      (uint)(auVar339[0] & 1) << 0x18 | (uint)(auVar363[0] & 1) << 0x19 |
                      (uint)(auVar387[0] & 1) << 0x1a | (uint)(auVar411[0] & 1) << 0x1b |
                      (uint)(auVar435[0] & 1) << 0x1c | (uint)(auVar459[0] & 1) << 0x1d |
                      (uint)(auVar483[0] & 1) << 0x1e | (uint)(bVar508 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar9[0] & 1) | (uint)(auVar25[0] & 1) << 1 |
                      (uint)(auVar41[0] & 1) << 2 | (uint)(auVar57[0] & 1) << 3 |
                      (uint)(auVar73[0] & 1) << 4 | (uint)(auVar89[0] & 1) << 5 |
                      (uint)(auVar105[0] & 1) << 6 | (uint)(auVar153[0] & 1) << 7 |
                      (uint)(auVar201[0] & 1) << 8 | (uint)(auVar249[0] & 1) << 9 |
                      (uint)(auVar297[0] & 1) << 10 | (uint)(auVar345[0] & 1) << 0xb |
                      (uint)(auVar393[0] & 1) << 0xc | (uint)(auVar441[0] & 1) << 0xd |
                      (uint)(auVar489[0] & 1) << 0xe | (uint)auVar121[0] << 0xf |
                      (uint)(auVar145[0] & 1) << 0x10 | (uint)(auVar169[0] & 1) << 0x11 |
                      (uint)(auVar193[0] & 1) << 0x12 | (uint)(auVar217[0] & 1) << 0x13 |
                      (uint)(auVar241[0] & 1) << 0x14 | (uint)(auVar265[0] & 1) << 0x15 |
                      (uint)(auVar289[0] & 1) << 0x16 | (uint)auVar313[0] << 0x17 |
                      (uint)(auVar337[0] & 1) << 0x18 | (uint)(auVar361[0] & 1) << 0x19 |
                      (uint)(auVar385[0] & 1) << 0x1a | (uint)(auVar409[0] & 1) << 0x1b |
                      (uint)(auVar433[0] & 1) << 0x1c | (uint)(auVar457[0] & 1) << 0x1d |
                      (uint)(auVar481[0] & 1) << 0x1e | (uint)(bVar506 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar7[0] & 1) | (uint)(auVar23[0] & 1) << 1 |
                      (uint)(auVar39[0] & 1) << 2 | (uint)(auVar55[0] & 1) << 3 |
                      (uint)(auVar71[0] & 1) << 4 | (uint)(auVar87[0] & 1) << 5 |
                      (uint)(auVar103[0] & 1) << 6 | (uint)(auVar135[0] & 1) << 7 |
                      (uint)(auVar183[0] & 1) << 8 | (uint)(auVar231[0] & 1) << 9 |
                      (uint)(auVar279[0] & 1) << 10 | (uint)(auVar327[0] & 1) << 0xb |
                      (uint)(auVar375[0] & 1) << 0xc | (uint)(auVar423[0] & 1) << 0xd |
                      (uint)(auVar471[0] & 1) << 0xe | (uint)auVar119[0] << 0xf |
                      (uint)(auVar143[0] & 1) << 0x10 | (uint)(auVar167[0] & 1) << 0x11 |
                      (uint)(auVar191[0] & 1) << 0x12 | (uint)(auVar215[0] & 1) << 0x13 |
                      (uint)(auVar239[0] & 1) << 0x14 | (uint)(auVar263[0] & 1) << 0x15 |
                      (uint)(auVar287[0] & 1) << 0x16 | (uint)auVar311[0] << 0x17 |
                      (uint)(auVar335[0] & 1) << 0x18 | (uint)(auVar359[0] & 1) << 0x19 |
                      (uint)(auVar383[0] & 1) << 0x1a | (uint)(auVar407[0] & 1) << 0x1b |
                      (uint)(auVar431[0] & 1) << 0x1c | (uint)(auVar455[0] & 1) << 0x1d |
                      (uint)(auVar479[0] & 1) << 0x1e | (uint)(bVar504 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar2[0] & 1) | (uint)(auVar18[0] & 1) << 1 |
                      (uint)(auVar34[0] & 1) << 2 | (uint)(auVar50[0] & 1) << 3 |
                      (uint)(auVar66[0] & 1) << 4 | (uint)(auVar82[0] & 1) << 5 |
                      (uint)(auVar98[0] & 1) << 6 | (uint)(auVar130[0] & 1) << 7 |
                      (uint)(auVar178[0] & 1) << 8 | (uint)(auVar226[0] & 1) << 9 |
                      (uint)(auVar274[0] & 1) << 10 | (uint)(auVar322[0] & 1) << 0xb |
                      (uint)(auVar370[0] & 1) << 0xc | (uint)(auVar418[0] & 1) << 0xd |
                      (uint)(auVar466[0] & 1) << 0xe | (uint)auVar114[0] << 0xf |
                      (uint)(auVar138[0] & 1) << 0x10 | (uint)(auVar162[0] & 1) << 0x11 |
                      (uint)(auVar186[0] & 1) << 0x12 | (uint)(auVar210[0] & 1) << 0x13 |
                      (uint)(auVar234[0] & 1) << 0x14 | (uint)(auVar258[0] & 1) << 0x15 |
                      (uint)(auVar282[0] & 1) << 0x16 | (uint)auVar306[0] << 0x17 |
                      (uint)(auVar330[0] & 1) << 0x18 | (uint)(auVar354[0] & 1) << 0x19 |
                      (uint)(auVar378[0] & 1) << 0x1a | (uint)(auVar402[0] & 1) << 0x1b |
                      (uint)(auVar426[0] & 1) << 0x1c | (uint)(auVar450[0] & 1) << 0x1d |
                      (uint)(auVar474[0] & 1) << 0x1e | (uint)(bVar499 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar520[0] & 1) | (uint)(auVar17[0] & 1) << 1 |
                      (uint)(auVar33[0] & 1) << 2 | (uint)(auVar49[0] & 1) << 3 |
                      (uint)(auVar65[0] & 1) << 4 | (uint)(auVar81[0] & 1) << 5 |
                      (uint)(auVar97[0] & 1) << 6 | (uint)(auVar129[0] & 1) << 7 |
                      (uint)(auVar177[0] & 1) << 8 | (uint)(auVar225[0] & 1) << 9 |
                      (uint)(auVar273[0] & 1) << 10 | (uint)(auVar321[0] & 1) << 0xb |
                      (uint)(auVar369[0] & 1) << 0xc | (uint)(auVar417[0] & 1) << 0xd |
                      (uint)(auVar465[0] & 1) << 0xe | (uint)auVar113[0] << 0xf |
                      (uint)(auVar137[0] & 1) << 0x10 | (uint)(auVar161[0] & 1) << 0x11 |
                      (uint)(auVar185[0] & 1) << 0x12 | (uint)(auVar209[0] & 1) << 0x13 |
                      (uint)(auVar233[0] & 1) << 0x14 | (uint)(auVar257[0] & 1) << 0x15 |
                      (uint)(auVar281[0] & 1) << 0x16 | (uint)auVar305[0] << 0x17 |
                      (uint)(auVar329[0] & 1) << 0x18 | (uint)(auVar353[0] & 1) << 0x19 |
                      (uint)(auVar377[0] & 1) << 0x1a | (uint)(auVar401[0] & 1) << 0x1b |
                      (uint)(auVar425[0] & 1) << 0x1c | (uint)(auVar449[0] & 1) << 0x1d |
                      (uint)(auVar473[0] & 1) << 0x1e | (uint)(bVar498 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar4[0] & 1) | (uint)(auVar20[0] & 1) << 1 |
                      (uint)(auVar36[0] & 1) << 2 | (uint)(auVar52[0] & 1) << 3 |
                      (uint)(auVar68[0] & 1) << 4 | (uint)(auVar84[0] & 1) << 5 |
                      (uint)(auVar100[0] & 1) << 6 | (uint)(auVar132[0] & 1) << 7 |
                      (uint)(auVar180[0] & 1) << 8 | (uint)(auVar228[0] & 1) << 9 |
                      (uint)(auVar276[0] & 1) << 10 | (uint)(auVar324[0] & 1) << 0xb |
                      (uint)(auVar372[0] & 1) << 0xc | (uint)(auVar420[0] & 1) << 0xd |
                      (uint)(auVar468[0] & 1) << 0xe | (uint)auVar116[0] << 0xf |
                      (uint)(auVar140[0] & 1) << 0x10 | (uint)(auVar164[0] & 1) << 0x11 |
                      (uint)(auVar188[0] & 1) << 0x12 | (uint)(auVar212[0] & 1) << 0x13 |
                      (uint)(auVar236[0] & 1) << 0x14 | (uint)(auVar260[0] & 1) << 0x15 |
                      (uint)(auVar284[0] & 1) << 0x16 | (uint)auVar308[0] << 0x17 |
                      (uint)(auVar332[0] & 1) << 0x18 | (uint)(auVar356[0] & 1) << 0x19 |
                      (uint)(auVar380[0] & 1) << 0x1a | (uint)(auVar404[0] & 1) << 0x1b |
                      (uint)(auVar428[0] & 1) << 0x1c | (uint)(auVar452[0] & 1) << 0x1d |
                      (uint)(auVar476[0] & 1) << 0x1e | (uint)(bVar501 >> 7) << 0x1f) +
             *(int *)((long)flags + lVar517 + -4);
        *(int *)((long)flags + lVar517 + 0x1c) =
             POPCOUNT((uint)(auVar16[0] & 1) | (uint)(auVar32[0] & 1) << 1 |
                      (uint)(auVar48[0] & 1) << 2 | (uint)(auVar64[0] & 1) << 3 |
                      (uint)(auVar80[0] & 1) << 4 | (uint)(auVar96[0] & 1) << 5 |
                      (uint)(auVar112[0] & 1) << 6 | (uint)(auVar160[0] & 1) << 7 |
                      (uint)(auVar208[0] & 1) << 8 | (uint)(auVar256[0] & 1) << 9 |
                      (uint)(auVar304[0] & 1) << 10 | (uint)(auVar352[0] & 1) << 0xb |
                      (uint)(auVar400[0] & 1) << 0xc | (uint)(auVar448[0] & 1) << 0xd |
                      (uint)(auVar496[0] & 1) << 0xe | (uint)auVar128[0] << 0xf |
                      (uint)(auVar152[0] & 1) << 0x10 | (uint)(auVar176[0] & 1) << 0x11 |
                      (uint)(auVar200[0] & 1) << 0x12 | (uint)(auVar224[0] & 1) << 0x13 |
                      (uint)(auVar248[0] & 1) << 0x14 | (uint)(auVar272[0] & 1) << 0x15 |
                      (uint)(auVar296[0] & 1) << 0x16 | (uint)auVar320[0] << 0x17 |
                      (uint)(auVar344[0] & 1) << 0x18 | (uint)(auVar368[0] & 1) << 0x19 |
                      (uint)(auVar392[0] & 1) << 0x1a | (uint)(auVar416[0] & 1) << 0x1b |
                      (uint)(auVar440[0] & 1) << 0x1c | (uint)(auVar464[0] & 1) << 0x1d |
                      (uint)(auVar488[0] & 1) << 0x1e | (uint)(bVar513 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar12[0] & 1) | (uint)(auVar28[0] & 1) << 1 |
                      (uint)(auVar44[0] & 1) << 2 | (uint)(auVar60[0] & 1) << 3 |
                      (uint)(auVar76[0] & 1) << 4 | (uint)(auVar92[0] & 1) << 5 |
                      (uint)(auVar108[0] & 1) << 6 | (uint)(auVar156[0] & 1) << 7 |
                      (uint)(auVar204[0] & 1) << 8 | (uint)(auVar252[0] & 1) << 9 |
                      (uint)(auVar300[0] & 1) << 10 | (uint)(auVar348[0] & 1) << 0xb |
                      (uint)(auVar396[0] & 1) << 0xc | (uint)(auVar444[0] & 1) << 0xd |
                      (uint)(auVar492[0] & 1) << 0xe | (uint)auVar124[0] << 0xf |
                      (uint)(auVar148[0] & 1) << 0x10 | (uint)(auVar172[0] & 1) << 0x11 |
                      (uint)(auVar196[0] & 1) << 0x12 | (uint)(auVar220[0] & 1) << 0x13 |
                      (uint)(auVar244[0] & 1) << 0x14 | (uint)(auVar268[0] & 1) << 0x15 |
                      (uint)(auVar292[0] & 1) << 0x16 | (uint)auVar316[0] << 0x17 |
                      (uint)(auVar340[0] & 1) << 0x18 | (uint)(auVar364[0] & 1) << 0x19 |
                      (uint)(auVar388[0] & 1) << 0x1a | (uint)(auVar412[0] & 1) << 0x1b |
                      (uint)(auVar436[0] & 1) << 0x1c | (uint)(auVar460[0] & 1) << 0x1d |
                      (uint)(auVar484[0] & 1) << 0x1e | (uint)(bVar509 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar13[0] & 1) | (uint)(auVar29[0] & 1) << 1 |
                      (uint)(auVar45[0] & 1) << 2 | (uint)(auVar61[0] & 1) << 3 |
                      (uint)(auVar77[0] & 1) << 4 | (uint)(auVar93[0] & 1) << 5 |
                      (uint)(auVar109[0] & 1) << 6 | (uint)(auVar157[0] & 1) << 7 |
                      (uint)(auVar205[0] & 1) << 8 | (uint)(auVar253[0] & 1) << 9 |
                      (uint)(auVar301[0] & 1) << 10 | (uint)(auVar349[0] & 1) << 0xb |
                      (uint)(auVar397[0] & 1) << 0xc | (uint)(auVar445[0] & 1) << 0xd |
                      (uint)(auVar493[0] & 1) << 0xe | (uint)auVar125[0] << 0xf |
                      (uint)(auVar149[0] & 1) << 0x10 | (uint)(auVar173[0] & 1) << 0x11 |
                      (uint)(auVar197[0] & 1) << 0x12 | (uint)(auVar221[0] & 1) << 0x13 |
                      (uint)(auVar245[0] & 1) << 0x14 | (uint)(auVar269[0] & 1) << 0x15 |
                      (uint)(auVar293[0] & 1) << 0x16 | (uint)auVar317[0] << 0x17 |
                      (uint)(auVar341[0] & 1) << 0x18 | (uint)(auVar365[0] & 1) << 0x19 |
                      (uint)(auVar389[0] & 1) << 0x1a | (uint)(auVar413[0] & 1) << 0x1b |
                      (uint)(auVar437[0] & 1) << 0x1c | (uint)(auVar461[0] & 1) << 0x1d |
                      (uint)(auVar485[0] & 1) << 0x1e | (uint)(bVar510 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar10[0] & 1) | (uint)(auVar26[0] & 1) << 1 |
                      (uint)(auVar42[0] & 1) << 2 | (uint)(auVar58[0] & 1) << 3 |
                      (uint)(auVar74[0] & 1) << 4 | (uint)(auVar90[0] & 1) << 5 |
                      (uint)(auVar106[0] & 1) << 6 | (uint)(auVar154[0] & 1) << 7 |
                      (uint)(auVar202[0] & 1) << 8 | (uint)(auVar250[0] & 1) << 9 |
                      (uint)(auVar298[0] & 1) << 10 | (uint)(auVar346[0] & 1) << 0xb |
                      (uint)(auVar394[0] & 1) << 0xc | (uint)(auVar442[0] & 1) << 0xd |
                      (uint)(auVar490[0] & 1) << 0xe | (uint)auVar122[0] << 0xf |
                      (uint)(auVar146[0] & 1) << 0x10 | (uint)(auVar170[0] & 1) << 0x11 |
                      (uint)(auVar194[0] & 1) << 0x12 | (uint)(auVar218[0] & 1) << 0x13 |
                      (uint)(auVar242[0] & 1) << 0x14 | (uint)(auVar266[0] & 1) << 0x15 |
                      (uint)(auVar290[0] & 1) << 0x16 | (uint)auVar314[0] << 0x17 |
                      (uint)(auVar338[0] & 1) << 0x18 | (uint)(auVar362[0] & 1) << 0x19 |
                      (uint)(auVar386[0] & 1) << 0x1a | (uint)(auVar410[0] & 1) << 0x1b |
                      (uint)(auVar434[0] & 1) << 0x1c | (uint)(auVar458[0] & 1) << 0x1d |
                      (uint)(auVar482[0] & 1) << 0x1e | (uint)(bVar507 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar8[0] & 1) | (uint)(auVar24[0] & 1) << 1 |
                      (uint)(auVar40[0] & 1) << 2 | (uint)(auVar56[0] & 1) << 3 |
                      (uint)(auVar72[0] & 1) << 4 | (uint)(auVar88[0] & 1) << 5 |
                      (uint)(auVar104[0] & 1) << 6 | (uint)(auVar136[0] & 1) << 7 |
                      (uint)(auVar184[0] & 1) << 8 | (uint)(auVar232[0] & 1) << 9 |
                      (uint)(auVar280[0] & 1) << 10 | (uint)(auVar328[0] & 1) << 0xb |
                      (uint)(auVar376[0] & 1) << 0xc | (uint)(auVar424[0] & 1) << 0xd |
                      (uint)(auVar472[0] & 1) << 0xe | (uint)auVar120[0] << 0xf |
                      (uint)(auVar144[0] & 1) << 0x10 | (uint)(auVar168[0] & 1) << 0x11 |
                      (uint)(auVar192[0] & 1) << 0x12 | (uint)(auVar216[0] & 1) << 0x13 |
                      (uint)(auVar240[0] & 1) << 0x14 | (uint)(auVar264[0] & 1) << 0x15 |
                      (uint)(auVar288[0] & 1) << 0x16 | (uint)auVar312[0] << 0x17 |
                      (uint)(auVar336[0] & 1) << 0x18 | (uint)(auVar360[0] & 1) << 0x19 |
                      (uint)(auVar384[0] & 1) << 0x1a | (uint)(auVar408[0] & 1) << 0x1b |
                      (uint)(auVar432[0] & 1) << 0x1c | (uint)(auVar456[0] & 1) << 0x1d |
                      (uint)(auVar480[0] & 1) << 0x1e | (uint)(bVar505 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar6[0] & 1) | (uint)(auVar22[0] & 1) << 1 |
                      (uint)(auVar38[0] & 1) << 2 | (uint)(auVar54[0] & 1) << 3 |
                      (uint)(auVar70[0] & 1) << 4 | (uint)(auVar86[0] & 1) << 5 |
                      (uint)(auVar102[0] & 1) << 6 | (uint)(auVar134[0] & 1) << 7 |
                      (uint)(auVar182[0] & 1) << 8 | (uint)(auVar230[0] & 1) << 9 |
                      (uint)(auVar278[0] & 1) << 10 | (uint)(auVar326[0] & 1) << 0xb |
                      (uint)(auVar374[0] & 1) << 0xc | (uint)(auVar422[0] & 1) << 0xd |
                      (uint)(auVar470[0] & 1) << 0xe | (uint)auVar118[0] << 0xf |
                      (uint)(auVar142[0] & 1) << 0x10 | (uint)(auVar166[0] & 1) << 0x11 |
                      (uint)(auVar190[0] & 1) << 0x12 | (uint)(auVar214[0] & 1) << 0x13 |
                      (uint)(auVar238[0] & 1) << 0x14 | (uint)(auVar262[0] & 1) << 0x15 |
                      (uint)(auVar286[0] & 1) << 0x16 | (uint)auVar310[0] << 0x17 |
                      (uint)(auVar334[0] & 1) << 0x18 | (uint)(auVar358[0] & 1) << 0x19 |
                      (uint)(auVar382[0] & 1) << 0x1a | (uint)(auVar406[0] & 1) << 0x1b |
                      (uint)(auVar430[0] & 1) << 0x1c | (uint)(auVar454[0] & 1) << 0x1d |
                      (uint)(auVar478[0] & 1) << 0x1e | (uint)(bVar503 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar3[0] & 1) | (uint)(auVar19[0] & 1) << 1 |
                      (uint)(auVar35[0] & 1) << 2 | (uint)(auVar51[0] & 1) << 3 |
                      (uint)(auVar67[0] & 1) << 4 | (uint)(auVar83[0] & 1) << 5 |
                      (uint)(auVar99[0] & 1) << 6 | (uint)(auVar131[0] & 1) << 7 |
                      (uint)(auVar179[0] & 1) << 8 | (uint)(auVar227[0] & 1) << 9 |
                      (uint)(auVar275[0] & 1) << 10 | (uint)(auVar323[0] & 1) << 0xb |
                      (uint)(auVar371[0] & 1) << 0xc | (uint)(auVar419[0] & 1) << 0xd |
                      (uint)(auVar467[0] & 1) << 0xe | (uint)auVar115[0] << 0xf |
                      (uint)(auVar139[0] & 1) << 0x10 | (uint)(auVar163[0] & 1) << 0x11 |
                      (uint)(auVar187[0] & 1) << 0x12 | (uint)(auVar211[0] & 1) << 0x13 |
                      (uint)(auVar235[0] & 1) << 0x14 | (uint)(auVar259[0] & 1) << 0x15 |
                      (uint)(auVar283[0] & 1) << 0x16 | (uint)auVar307[0] << 0x17 |
                      (uint)(auVar331[0] & 1) << 0x18 | (uint)(auVar355[0] & 1) << 0x19 |
                      (uint)(auVar379[0] & 1) << 0x1a | (uint)(auVar403[0] & 1) << 0x1b |
                      (uint)(auVar427[0] & 1) << 0x1c | (uint)(auVar451[0] & 1) << 0x1d |
                      (uint)(auVar475[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f) +
             POPCOUNT((uint)(auVar5[0] & 1) | (uint)(auVar21[0] & 1) << 1 |
                      (uint)(auVar37[0] & 1) << 2 | (uint)(auVar53[0] & 1) << 3 |
                      (uint)(auVar69[0] & 1) << 4 | (uint)(auVar85[0] & 1) << 5 |
                      (uint)(auVar101[0] & 1) << 6 | (uint)(auVar133[0] & 1) << 7 |
                      (uint)(auVar181[0] & 1) << 8 | (uint)(auVar229[0] & 1) << 9 |
                      (uint)(auVar277[0] & 1) << 10 | (uint)(auVar325[0] & 1) << 0xb |
                      (uint)(auVar373[0] & 1) << 0xc | (uint)(auVar421[0] & 1) << 0xd |
                      (uint)(auVar469[0] & 1) << 0xe | (uint)auVar117[0] << 0xf |
                      (uint)(auVar141[0] & 1) << 0x10 | (uint)(auVar165[0] & 1) << 0x11 |
                      (uint)(auVar189[0] & 1) << 0x12 | (uint)(auVar213[0] & 1) << 0x13 |
                      (uint)(auVar237[0] & 1) << 0x14 | (uint)(auVar261[0] & 1) << 0x15 |
                      (uint)(auVar285[0] & 1) << 0x16 | (uint)auVar309[0] << 0x17 |
                      (uint)(auVar333[0] & 1) << 0x18 | (uint)(auVar357[0] & 1) << 0x19 |
                      (uint)(auVar381[0] & 1) << 0x1a | (uint)(auVar405[0] & 1) << 0x1b |
                      (uint)(auVar429[0] & 1) << 0x1c | (uint)(auVar453[0] & 1) << 0x1d |
                      (uint)(auVar477[0] & 1) << 0x1e | (uint)(bVar502 >> 7) << 0x1f) +
             *(int *)((long)flags + lVar517 + 0x1c);
        lVar517 = lVar517 + -4;
      } while (lVar517 != 0);
      uVar515 = uVar516;
      uVar514 = uVar516 + 0x10;
    } while (uVar516 + 0x10 <= uVar497);
  }
  auVar534 = _DAT_0011d0c0;
  auVar533 = _DAT_0011d0a0;
  uVar515 = uVar516 | 8;
  auVar535 = _DAT_0011d0a0;
  auVar536 = _DAT_0011d0c0;
  while (uVar514 = uVar515, auVar525 = auVar535, auVar526 = auVar536, uVar514 <= uVar497) {
    lVar517 = 0x20;
    auVar525 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10),auVar533,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x10));
    auVar526 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x10),auVar534,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10));
    auVar527 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x20),auVar533,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x30));
    auVar528 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x30),auVar534,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x20));
    auVar529 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x40),auVar533,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x50));
    auVar530 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x50),auVar534,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x40));
    auVar531 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x60),auVar533,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x70));
    auVar532 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x70),auVar534,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x60));
    _DAT_0011d0a0 = auVar535;
    _DAT_0011d0c0 = auVar536;
    do {
      auVar535 = auVar527 >> 7;
      auVar520 = auVar527 >> 0xf;
      auVar9 = auVar527 >> 0x17;
      auVar17 = auVar527 >> 0x1f;
      auVar25 = auVar527 >> 0x27;
      auVar33 = auVar527 >> 0x2f;
      auVar41 = auVar527 >> 0x37;
      auVar49 = auVar527 >> 0x3f;
      auVar57 = auVar527 >> 0x47;
      auVar65 = auVar527 >> 0x4f;
      auVar73 = auVar527 >> 0x57;
      auVar81 = auVar527 >> 0x5f;
      auVar89 = auVar527 >> 0x67;
      auVar97 = auVar527 >> 0x6f;
      auVar105 = auVar527 >> 0x77;
      auVar129 = auVar527 >> 0x7f;
      auVar153 = auVar527 >> 0x87;
      auVar177 = auVar527 >> 0x8f;
      auVar201 = auVar527 >> 0x97;
      auVar225 = auVar527 >> 0x9f;
      auVar249 = auVar527 >> 0xa7;
      auVar273 = auVar527 >> 0xaf;
      auVar297 = auVar527 >> 0xb7;
      auVar321 = auVar527 >> 0xbf;
      auVar345 = auVar527 >> 199;
      auVar369 = auVar527 >> 0xcf;
      auVar393 = auVar527 >> 0xd7;
      auVar417 = auVar527 >> 0xdf;
      auVar441 = auVar527 >> 0xe7;
      auVar465 = auVar527 >> 0xef;
      auVar489 = auVar527 >> 0xf7;
      bVar498 = auVar527[0x1f];
      auVar536 = auVar529 >> 7;
      auVar2 = auVar529 >> 0xf;
      auVar10 = auVar529 >> 0x17;
      auVar18 = auVar529 >> 0x1f;
      auVar26 = auVar529 >> 0x27;
      auVar34 = auVar529 >> 0x2f;
      auVar42 = auVar529 >> 0x37;
      auVar50 = auVar529 >> 0x3f;
      auVar58 = auVar529 >> 0x47;
      auVar66 = auVar529 >> 0x4f;
      auVar74 = auVar529 >> 0x57;
      auVar82 = auVar529 >> 0x5f;
      auVar90 = auVar529 >> 0x67;
      auVar98 = auVar529 >> 0x6f;
      auVar106 = auVar529 >> 0x77;
      auVar130 = auVar529 >> 0x7f;
      auVar154 = auVar529 >> 0x87;
      auVar178 = auVar529 >> 0x8f;
      auVar202 = auVar529 >> 0x97;
      auVar226 = auVar529 >> 0x9f;
      auVar250 = auVar529 >> 0xa7;
      auVar274 = auVar529 >> 0xaf;
      auVar298 = auVar529 >> 0xb7;
      auVar322 = auVar529 >> 0xbf;
      auVar346 = auVar529 >> 199;
      auVar370 = auVar529 >> 0xcf;
      auVar394 = auVar529 >> 0xd7;
      auVar418 = auVar529 >> 0xdf;
      auVar442 = auVar529 >> 0xe7;
      auVar466 = auVar529 >> 0xef;
      auVar490 = auVar529 >> 0xf7;
      bVar499 = auVar529[0x1f];
      auVar523 = auVar525 >> 7;
      auVar3 = auVar525 >> 0xf;
      auVar11 = auVar525 >> 0x17;
      auVar19 = auVar525 >> 0x1f;
      auVar27 = auVar525 >> 0x27;
      auVar35 = auVar525 >> 0x2f;
      auVar43 = auVar525 >> 0x37;
      auVar51 = auVar525 >> 0x3f;
      auVar59 = auVar525 >> 0x47;
      auVar67 = auVar525 >> 0x4f;
      auVar75 = auVar525 >> 0x57;
      auVar83 = auVar525 >> 0x5f;
      auVar91 = auVar525 >> 0x67;
      auVar99 = auVar525 >> 0x6f;
      auVar107 = auVar525 >> 0x77;
      auVar131 = auVar525 >> 0x7f;
      auVar155 = auVar525 >> 0x87;
      auVar179 = auVar525 >> 0x8f;
      auVar203 = auVar525 >> 0x97;
      auVar227 = auVar525 >> 0x9f;
      auVar251 = auVar525 >> 0xa7;
      auVar275 = auVar525 >> 0xaf;
      auVar299 = auVar525 >> 0xb7;
      auVar323 = auVar525 >> 0xbf;
      auVar347 = auVar525 >> 199;
      auVar371 = auVar525 >> 0xcf;
      auVar395 = auVar525 >> 0xd7;
      auVar419 = auVar525 >> 0xdf;
      auVar443 = auVar525 >> 0xe7;
      auVar467 = auVar525 >> 0xef;
      auVar491 = auVar525 >> 0xf7;
      bVar500 = auVar525[0x1f];
      auVar518 = auVar528 >> 7;
      auVar4 = auVar528 >> 0xf;
      auVar12 = auVar528 >> 0x17;
      auVar20 = auVar528 >> 0x1f;
      auVar28 = auVar528 >> 0x27;
      auVar36 = auVar528 >> 0x2f;
      auVar44 = auVar528 >> 0x37;
      auVar52 = auVar528 >> 0x3f;
      auVar60 = auVar528 >> 0x47;
      auVar68 = auVar528 >> 0x4f;
      auVar76 = auVar528 >> 0x57;
      auVar84 = auVar528 >> 0x5f;
      auVar92 = auVar528 >> 0x67;
      auVar100 = auVar528 >> 0x6f;
      auVar108 = auVar528 >> 0x77;
      auVar132 = auVar528 >> 0x7f;
      auVar156 = auVar528 >> 0x87;
      auVar180 = auVar528 >> 0x8f;
      auVar204 = auVar528 >> 0x97;
      auVar228 = auVar528 >> 0x9f;
      auVar252 = auVar528 >> 0xa7;
      auVar276 = auVar528 >> 0xaf;
      auVar300 = auVar528 >> 0xb7;
      auVar324 = auVar528 >> 0xbf;
      auVar348 = auVar528 >> 199;
      auVar372 = auVar528 >> 0xcf;
      auVar396 = auVar528 >> 0xd7;
      auVar420 = auVar528 >> 0xdf;
      auVar444 = auVar528 >> 0xe7;
      auVar468 = auVar528 >> 0xef;
      auVar492 = auVar528 >> 0xf7;
      bVar501 = auVar528[0x1f];
      auVar521 = auVar526 >> 7;
      auVar5 = auVar526 >> 0xf;
      auVar13 = auVar526 >> 0x17;
      auVar21 = auVar526 >> 0x1f;
      auVar29 = auVar526 >> 0x27;
      auVar37 = auVar526 >> 0x2f;
      auVar45 = auVar526 >> 0x37;
      auVar53 = auVar526 >> 0x3f;
      auVar61 = auVar526 >> 0x47;
      auVar69 = auVar526 >> 0x4f;
      auVar77 = auVar526 >> 0x57;
      auVar85 = auVar526 >> 0x5f;
      auVar93 = auVar526 >> 0x67;
      auVar101 = auVar526 >> 0x6f;
      auVar109 = auVar526 >> 0x77;
      auVar133 = auVar526 >> 0x7f;
      auVar157 = auVar526 >> 0x87;
      auVar181 = auVar526 >> 0x8f;
      auVar205 = auVar526 >> 0x97;
      auVar229 = auVar526 >> 0x9f;
      auVar253 = auVar526 >> 0xa7;
      auVar277 = auVar526 >> 0xaf;
      auVar301 = auVar526 >> 0xb7;
      auVar325 = auVar526 >> 0xbf;
      auVar349 = auVar526 >> 199;
      auVar373 = auVar526 >> 0xcf;
      auVar397 = auVar526 >> 0xd7;
      auVar421 = auVar526 >> 0xdf;
      auVar445 = auVar526 >> 0xe7;
      auVar469 = auVar526 >> 0xef;
      auVar493 = auVar526 >> 0xf7;
      bVar502 = auVar526[0x1f];
      auVar525 = vpaddb_avx2(auVar525,auVar525);
      auVar526 = vpaddb_avx2(auVar526,auVar526);
      auVar527 = vpaddb_avx2(auVar527,auVar527);
      auVar528 = vpaddb_avx2(auVar528,auVar528);
      auVar529 = vpaddb_avx2(auVar529,auVar529);
      auVar522 = auVar530 >> 7;
      auVar6 = auVar530 >> 0xf;
      auVar14 = auVar530 >> 0x17;
      auVar22 = auVar530 >> 0x1f;
      auVar30 = auVar530 >> 0x27;
      auVar38 = auVar530 >> 0x2f;
      auVar46 = auVar530 >> 0x37;
      auVar54 = auVar530 >> 0x3f;
      auVar62 = auVar530 >> 0x47;
      auVar70 = auVar530 >> 0x4f;
      auVar78 = auVar530 >> 0x57;
      auVar86 = auVar530 >> 0x5f;
      auVar94 = auVar530 >> 0x67;
      auVar102 = auVar530 >> 0x6f;
      auVar110 = auVar530 >> 0x77;
      auVar134 = auVar530 >> 0x7f;
      auVar158 = auVar530 >> 0x87;
      auVar182 = auVar530 >> 0x8f;
      auVar206 = auVar530 >> 0x97;
      auVar230 = auVar530 >> 0x9f;
      auVar254 = auVar530 >> 0xa7;
      auVar278 = auVar530 >> 0xaf;
      auVar302 = auVar530 >> 0xb7;
      auVar326 = auVar530 >> 0xbf;
      auVar350 = auVar530 >> 199;
      auVar374 = auVar530 >> 0xcf;
      auVar398 = auVar530 >> 0xd7;
      auVar422 = auVar530 >> 0xdf;
      auVar446 = auVar530 >> 0xe7;
      auVar470 = auVar530 >> 0xef;
      auVar494 = auVar530 >> 0xf7;
      bVar503 = auVar530[0x1f];
      auVar530 = vpaddb_avx2(auVar530,auVar530);
      auVar524 = auVar531 >> 7;
      auVar7 = auVar531 >> 0xf;
      auVar15 = auVar531 >> 0x17;
      auVar23 = auVar531 >> 0x1f;
      auVar31 = auVar531 >> 0x27;
      auVar39 = auVar531 >> 0x2f;
      auVar47 = auVar531 >> 0x37;
      auVar55 = auVar531 >> 0x3f;
      auVar63 = auVar531 >> 0x47;
      auVar71 = auVar531 >> 0x4f;
      auVar79 = auVar531 >> 0x57;
      auVar87 = auVar531 >> 0x5f;
      auVar95 = auVar531 >> 0x67;
      auVar103 = auVar531 >> 0x6f;
      auVar111 = auVar531 >> 0x77;
      auVar135 = auVar531 >> 0x7f;
      auVar159 = auVar531 >> 0x87;
      auVar183 = auVar531 >> 0x8f;
      auVar207 = auVar531 >> 0x97;
      auVar231 = auVar531 >> 0x9f;
      auVar255 = auVar531 >> 0xa7;
      auVar279 = auVar531 >> 0xaf;
      auVar303 = auVar531 >> 0xb7;
      auVar327 = auVar531 >> 0xbf;
      auVar351 = auVar531 >> 199;
      auVar375 = auVar531 >> 0xcf;
      auVar399 = auVar531 >> 0xd7;
      auVar423 = auVar531 >> 0xdf;
      auVar447 = auVar531 >> 0xe7;
      auVar471 = auVar531 >> 0xef;
      auVar495 = auVar531 >> 0xf7;
      bVar504 = auVar531[0x1f];
      auVar531 = vpaddb_avx2(auVar531,auVar531);
      auVar519 = auVar532 >> 7;
      auVar8 = auVar532 >> 0xf;
      auVar16 = auVar532 >> 0x17;
      auVar24 = auVar532 >> 0x1f;
      auVar32 = auVar532 >> 0x27;
      auVar40 = auVar532 >> 0x2f;
      auVar48 = auVar532 >> 0x37;
      auVar56 = auVar532 >> 0x3f;
      auVar64 = auVar532 >> 0x47;
      auVar72 = auVar532 >> 0x4f;
      auVar80 = auVar532 >> 0x57;
      auVar88 = auVar532 >> 0x5f;
      auVar96 = auVar532 >> 0x67;
      auVar104 = auVar532 >> 0x6f;
      auVar112 = auVar532 >> 0x77;
      auVar136 = auVar532 >> 0x7f;
      auVar160 = auVar532 >> 0x87;
      auVar184 = auVar532 >> 0x8f;
      auVar208 = auVar532 >> 0x97;
      auVar232 = auVar532 >> 0x9f;
      auVar256 = auVar532 >> 0xa7;
      auVar280 = auVar532 >> 0xaf;
      auVar304 = auVar532 >> 0xb7;
      auVar328 = auVar532 >> 0xbf;
      auVar352 = auVar532 >> 199;
      auVar376 = auVar532 >> 0xcf;
      auVar400 = auVar532 >> 0xd7;
      auVar424 = auVar532 >> 0xdf;
      auVar448 = auVar532 >> 0xe7;
      auVar472 = auVar532 >> 0xef;
      auVar496 = auVar532 >> 0xf7;
      bVar505 = auVar532[0x1f];
      auVar532 = vpaddb_avx2(auVar532,auVar532);
      *(int *)((long)flags + lVar517 + -4) =
           POPCOUNT((uint)(auVar524[0] & 1) | (uint)(auVar7[0] & 1) << 1 |
                    (uint)(auVar15[0] & 1) << 2 | (uint)(auVar23[0] & 1) << 3 |
                    (uint)(auVar31[0] & 1) << 4 | (uint)(auVar39[0] & 1) << 5 |
                    (uint)(auVar47[0] & 1) << 6 | (uint)(auVar55[0] & 1) << 7 |
                    (uint)(auVar63[0] & 1) << 8 | (uint)(auVar71[0] & 1) << 9 |
                    (uint)(auVar79[0] & 1) << 10 | (uint)(auVar87[0] & 1) << 0xb |
                    (uint)(auVar95[0] & 1) << 0xc | (uint)(auVar103[0] & 1) << 0xd |
                    (uint)(auVar111[0] & 1) << 0xe | (uint)auVar135[0] << 0xf |
                    (uint)(auVar159[0] & 1) << 0x10 | (uint)(auVar183[0] & 1) << 0x11 |
                    (uint)(auVar207[0] & 1) << 0x12 | (uint)(auVar231[0] & 1) << 0x13 |
                    (uint)(auVar255[0] & 1) << 0x14 | (uint)(auVar279[0] & 1) << 0x15 |
                    (uint)(auVar303[0] & 1) << 0x16 | (uint)auVar327[0] << 0x17 |
                    (uint)(auVar351[0] & 1) << 0x18 | (uint)(auVar375[0] & 1) << 0x19 |
                    (uint)(auVar399[0] & 1) << 0x1a | (uint)(auVar423[0] & 1) << 0x1b |
                    (uint)(auVar447[0] & 1) << 0x1c | (uint)(auVar471[0] & 1) << 0x1d |
                    (uint)(auVar495[0] & 1) << 0x1e | (uint)(bVar504 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar536[0] & 1) | (uint)(auVar2[0] & 1) << 1 |
                    (uint)(auVar10[0] & 1) << 2 | (uint)(auVar18[0] & 1) << 3 |
                    (uint)(auVar26[0] & 1) << 4 | (uint)(auVar34[0] & 1) << 5 |
                    (uint)(auVar42[0] & 1) << 6 | (uint)(auVar50[0] & 1) << 7 |
                    (uint)(auVar58[0] & 1) << 8 | (uint)(auVar66[0] & 1) << 9 |
                    (uint)(auVar74[0] & 1) << 10 | (uint)(auVar82[0] & 1) << 0xb |
                    (uint)(auVar90[0] & 1) << 0xc | (uint)(auVar98[0] & 1) << 0xd |
                    (uint)(auVar106[0] & 1) << 0xe | (uint)auVar130[0] << 0xf |
                    (uint)(auVar154[0] & 1) << 0x10 | (uint)(auVar178[0] & 1) << 0x11 |
                    (uint)(auVar202[0] & 1) << 0x12 | (uint)(auVar226[0] & 1) << 0x13 |
                    (uint)(auVar250[0] & 1) << 0x14 | (uint)(auVar274[0] & 1) << 0x15 |
                    (uint)(auVar298[0] & 1) << 0x16 | (uint)auVar322[0] << 0x17 |
                    (uint)(auVar346[0] & 1) << 0x18 | (uint)(auVar370[0] & 1) << 0x19 |
                    (uint)(auVar394[0] & 1) << 0x1a | (uint)(auVar418[0] & 1) << 0x1b |
                    (uint)(auVar442[0] & 1) << 0x1c | (uint)(auVar466[0] & 1) << 0x1d |
                    (uint)(auVar490[0] & 1) << 0x1e | (uint)(bVar499 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar535[0] & 1) | (uint)(auVar520[0] & 1) << 1 |
                    (uint)(auVar9[0] & 1) << 2 | (uint)(auVar17[0] & 1) << 3 |
                    (uint)(auVar25[0] & 1) << 4 | (uint)(auVar33[0] & 1) << 5 |
                    (uint)(auVar41[0] & 1) << 6 | (uint)(auVar49[0] & 1) << 7 |
                    (uint)(auVar57[0] & 1) << 8 | (uint)(auVar65[0] & 1) << 9 |
                    (uint)(auVar73[0] & 1) << 10 | (uint)(auVar81[0] & 1) << 0xb |
                    (uint)(auVar89[0] & 1) << 0xc | (uint)(auVar97[0] & 1) << 0xd |
                    (uint)(auVar105[0] & 1) << 0xe | (uint)auVar129[0] << 0xf |
                    (uint)(auVar153[0] & 1) << 0x10 | (uint)(auVar177[0] & 1) << 0x11 |
                    (uint)(auVar201[0] & 1) << 0x12 | (uint)(auVar225[0] & 1) << 0x13 |
                    (uint)(auVar249[0] & 1) << 0x14 | (uint)(auVar273[0] & 1) << 0x15 |
                    (uint)(auVar297[0] & 1) << 0x16 | (uint)auVar321[0] << 0x17 |
                    (uint)(auVar345[0] & 1) << 0x18 | (uint)(auVar369[0] & 1) << 0x19 |
                    (uint)(auVar393[0] & 1) << 0x1a | (uint)(auVar417[0] & 1) << 0x1b |
                    (uint)(auVar441[0] & 1) << 0x1c | (uint)(auVar465[0] & 1) << 0x1d |
                    (uint)(auVar489[0] & 1) << 0x1e | (uint)(bVar498 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar523[0] & 1) | (uint)(auVar3[0] & 1) << 1 |
                    (uint)(auVar11[0] & 1) << 2 | (uint)(auVar19[0] & 1) << 3 |
                    (uint)(auVar27[0] & 1) << 4 | (uint)(auVar35[0] & 1) << 5 |
                    (uint)(auVar43[0] & 1) << 6 | (uint)(auVar51[0] & 1) << 7 |
                    (uint)(auVar59[0] & 1) << 8 | (uint)(auVar67[0] & 1) << 9 |
                    (uint)(auVar75[0] & 1) << 10 | (uint)(auVar83[0] & 1) << 0xb |
                    (uint)(auVar91[0] & 1) << 0xc | (uint)(auVar99[0] & 1) << 0xd |
                    (uint)(auVar107[0] & 1) << 0xe | (uint)auVar131[0] << 0xf |
                    (uint)(auVar155[0] & 1) << 0x10 | (uint)(auVar179[0] & 1) << 0x11 |
                    (uint)(auVar203[0] & 1) << 0x12 | (uint)(auVar227[0] & 1) << 0x13 |
                    (uint)(auVar251[0] & 1) << 0x14 | (uint)(auVar275[0] & 1) << 0x15 |
                    (uint)(auVar299[0] & 1) << 0x16 | (uint)auVar323[0] << 0x17 |
                    (uint)(auVar347[0] & 1) << 0x18 | (uint)(auVar371[0] & 1) << 0x19 |
                    (uint)(auVar395[0] & 1) << 0x1a | (uint)(auVar419[0] & 1) << 0x1b |
                    (uint)(auVar443[0] & 1) << 0x1c | (uint)(auVar467[0] & 1) << 0x1d |
                    (uint)(auVar491[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar517 + -4);
      *(int *)((long)flags + lVar517 + 0x1c) =
           POPCOUNT((uint)(auVar519[0] & 1) | (uint)(auVar8[0] & 1) << 1 |
                    (uint)(auVar16[0] & 1) << 2 | (uint)(auVar24[0] & 1) << 3 |
                    (uint)(auVar32[0] & 1) << 4 | (uint)(auVar40[0] & 1) << 5 |
                    (uint)(auVar48[0] & 1) << 6 | (uint)(auVar56[0] & 1) << 7 |
                    (uint)(auVar64[0] & 1) << 8 | (uint)(auVar72[0] & 1) << 9 |
                    (uint)(auVar80[0] & 1) << 10 | (uint)(auVar88[0] & 1) << 0xb |
                    (uint)(auVar96[0] & 1) << 0xc | (uint)(auVar104[0] & 1) << 0xd |
                    (uint)(auVar112[0] & 1) << 0xe | (uint)auVar136[0] << 0xf |
                    (uint)(auVar160[0] & 1) << 0x10 | (uint)(auVar184[0] & 1) << 0x11 |
                    (uint)(auVar208[0] & 1) << 0x12 | (uint)(auVar232[0] & 1) << 0x13 |
                    (uint)(auVar256[0] & 1) << 0x14 | (uint)(auVar280[0] & 1) << 0x15 |
                    (uint)(auVar304[0] & 1) << 0x16 | (uint)auVar328[0] << 0x17 |
                    (uint)(auVar352[0] & 1) << 0x18 | (uint)(auVar376[0] & 1) << 0x19 |
                    (uint)(auVar400[0] & 1) << 0x1a | (uint)(auVar424[0] & 1) << 0x1b |
                    (uint)(auVar448[0] & 1) << 0x1c | (uint)(auVar472[0] & 1) << 0x1d |
                    (uint)(auVar496[0] & 1) << 0x1e | (uint)(bVar505 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar522[0] & 1) | (uint)(auVar6[0] & 1) << 1 |
                    (uint)(auVar14[0] & 1) << 2 | (uint)(auVar22[0] & 1) << 3 |
                    (uint)(auVar30[0] & 1) << 4 | (uint)(auVar38[0] & 1) << 5 |
                    (uint)(auVar46[0] & 1) << 6 | (uint)(auVar54[0] & 1) << 7 |
                    (uint)(auVar62[0] & 1) << 8 | (uint)(auVar70[0] & 1) << 9 |
                    (uint)(auVar78[0] & 1) << 10 | (uint)(auVar86[0] & 1) << 0xb |
                    (uint)(auVar94[0] & 1) << 0xc | (uint)(auVar102[0] & 1) << 0xd |
                    (uint)(auVar110[0] & 1) << 0xe | (uint)auVar134[0] << 0xf |
                    (uint)(auVar158[0] & 1) << 0x10 | (uint)(auVar182[0] & 1) << 0x11 |
                    (uint)(auVar206[0] & 1) << 0x12 | (uint)(auVar230[0] & 1) << 0x13 |
                    (uint)(auVar254[0] & 1) << 0x14 | (uint)(auVar278[0] & 1) << 0x15 |
                    (uint)(auVar302[0] & 1) << 0x16 | (uint)auVar326[0] << 0x17 |
                    (uint)(auVar350[0] & 1) << 0x18 | (uint)(auVar374[0] & 1) << 0x19 |
                    (uint)(auVar398[0] & 1) << 0x1a | (uint)(auVar422[0] & 1) << 0x1b |
                    (uint)(auVar446[0] & 1) << 0x1c | (uint)(auVar470[0] & 1) << 0x1d |
                    (uint)(auVar494[0] & 1) << 0x1e | (uint)(bVar503 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar518[0] & 1) | (uint)(auVar4[0] & 1) << 1 |
                    (uint)(auVar12[0] & 1) << 2 | (uint)(auVar20[0] & 1) << 3 |
                    (uint)(auVar28[0] & 1) << 4 | (uint)(auVar36[0] & 1) << 5 |
                    (uint)(auVar44[0] & 1) << 6 | (uint)(auVar52[0] & 1) << 7 |
                    (uint)(auVar60[0] & 1) << 8 | (uint)(auVar68[0] & 1) << 9 |
                    (uint)(auVar76[0] & 1) << 10 | (uint)(auVar84[0] & 1) << 0xb |
                    (uint)(auVar92[0] & 1) << 0xc | (uint)(auVar100[0] & 1) << 0xd |
                    (uint)(auVar108[0] & 1) << 0xe | (uint)auVar132[0] << 0xf |
                    (uint)(auVar156[0] & 1) << 0x10 | (uint)(auVar180[0] & 1) << 0x11 |
                    (uint)(auVar204[0] & 1) << 0x12 | (uint)(auVar228[0] & 1) << 0x13 |
                    (uint)(auVar252[0] & 1) << 0x14 | (uint)(auVar276[0] & 1) << 0x15 |
                    (uint)(auVar300[0] & 1) << 0x16 | (uint)auVar324[0] << 0x17 |
                    (uint)(auVar348[0] & 1) << 0x18 | (uint)(auVar372[0] & 1) << 0x19 |
                    (uint)(auVar396[0] & 1) << 0x1a | (uint)(auVar420[0] & 1) << 0x1b |
                    (uint)(auVar444[0] & 1) << 0x1c | (uint)(auVar468[0] & 1) << 0x1d |
                    (uint)(auVar492[0] & 1) << 0x1e | (uint)(bVar501 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar521[0] & 1) | (uint)(auVar5[0] & 1) << 1 |
                    (uint)(auVar13[0] & 1) << 2 | (uint)(auVar21[0] & 1) << 3 |
                    (uint)(auVar29[0] & 1) << 4 | (uint)(auVar37[0] & 1) << 5 |
                    (uint)(auVar45[0] & 1) << 6 | (uint)(auVar53[0] & 1) << 7 |
                    (uint)(auVar61[0] & 1) << 8 | (uint)(auVar69[0] & 1) << 9 |
                    (uint)(auVar77[0] & 1) << 10 | (uint)(auVar85[0] & 1) << 0xb |
                    (uint)(auVar93[0] & 1) << 0xc | (uint)(auVar101[0] & 1) << 0xd |
                    (uint)(auVar109[0] & 1) << 0xe | (uint)auVar133[0] << 0xf |
                    (uint)(auVar157[0] & 1) << 0x10 | (uint)(auVar181[0] & 1) << 0x11 |
                    (uint)(auVar205[0] & 1) << 0x12 | (uint)(auVar229[0] & 1) << 0x13 |
                    (uint)(auVar253[0] & 1) << 0x14 | (uint)(auVar277[0] & 1) << 0x15 |
                    (uint)(auVar301[0] & 1) << 0x16 | (uint)auVar325[0] << 0x17 |
                    (uint)(auVar349[0] & 1) << 0x18 | (uint)(auVar373[0] & 1) << 0x19 |
                    (uint)(auVar397[0] & 1) << 0x1a | (uint)(auVar421[0] & 1) << 0x1b |
                    (uint)(auVar445[0] & 1) << 0x1c | (uint)(auVar469[0] & 1) << 0x1d |
                    (uint)(auVar493[0] & 1) << 0x1e | (uint)(bVar502 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar517 + 0x1c);
      lVar517 = lVar517 + -4;
    } while (lVar517 != 0);
    uVar516 = uVar514;
    auVar535 = _DAT_0011d0a0;
    auVar536 = _DAT_0011d0c0;
    uVar515 = uVar514 + 8;
  }
  while (uVar515 = uVar516 + 4, _DAT_0011d0a0 = auVar525, _DAT_0011d0c0 = auVar526,
        uVar515 <= uVar497) {
    lVar517 = 0x20;
    auVar533 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10),auVar535,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x10));
    auVar534 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x10),auVar536,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10));
    auVar527 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x20),auVar535,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x30));
    auVar528 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x30),auVar536,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x20));
    do {
      auVar525 = auVar533 >> 7;
      auVar531 = auVar533 >> 0xf;
      auVar521 = auVar533 >> 0x17;
      auVar520 = auVar533 >> 0x1f;
      auVar5 = auVar533 >> 0x27;
      auVar9 = auVar533 >> 0x2f;
      auVar13 = auVar533 >> 0x37;
      auVar17 = auVar533 >> 0x3f;
      auVar21 = auVar533 >> 0x47;
      auVar25 = auVar533 >> 0x4f;
      auVar29 = auVar533 >> 0x57;
      auVar33 = auVar533 >> 0x5f;
      auVar37 = auVar533 >> 0x67;
      auVar41 = auVar533 >> 0x6f;
      auVar45 = auVar533 >> 0x77;
      auVar49 = auVar533 >> 0x7f;
      auVar53 = auVar533 >> 0x87;
      auVar57 = auVar533 >> 0x8f;
      auVar61 = auVar533 >> 0x97;
      auVar65 = auVar533 >> 0x9f;
      auVar69 = auVar533 >> 0xa7;
      auVar73 = auVar533 >> 0xaf;
      auVar77 = auVar533 >> 0xb7;
      auVar81 = auVar533 >> 0xbf;
      auVar85 = auVar533 >> 199;
      auVar89 = auVar533 >> 0xcf;
      auVar93 = auVar533 >> 0xd7;
      auVar97 = auVar533 >> 0xdf;
      auVar101 = auVar533 >> 0xe7;
      auVar105 = auVar533 >> 0xef;
      auVar109 = auVar533 >> 0xf7;
      bVar498 = auVar533[0x1f];
      auVar526 = auVar534 >> 7;
      auVar532 = auVar534 >> 0xf;
      auVar522 = auVar534 >> 0x17;
      auVar2 = auVar534 >> 0x1f;
      auVar6 = auVar534 >> 0x27;
      auVar10 = auVar534 >> 0x2f;
      auVar14 = auVar534 >> 0x37;
      auVar18 = auVar534 >> 0x3f;
      auVar22 = auVar534 >> 0x47;
      auVar26 = auVar534 >> 0x4f;
      auVar30 = auVar534 >> 0x57;
      auVar34 = auVar534 >> 0x5f;
      auVar38 = auVar534 >> 0x67;
      auVar42 = auVar534 >> 0x6f;
      auVar46 = auVar534 >> 0x77;
      auVar50 = auVar534 >> 0x7f;
      auVar54 = auVar534 >> 0x87;
      auVar58 = auVar534 >> 0x8f;
      auVar62 = auVar534 >> 0x97;
      auVar66 = auVar534 >> 0x9f;
      auVar70 = auVar534 >> 0xa7;
      auVar74 = auVar534 >> 0xaf;
      auVar78 = auVar534 >> 0xb7;
      auVar82 = auVar534 >> 0xbf;
      auVar86 = auVar534 >> 199;
      auVar90 = auVar534 >> 0xcf;
      auVar94 = auVar534 >> 0xd7;
      auVar98 = auVar534 >> 0xdf;
      auVar102 = auVar534 >> 0xe7;
      auVar106 = auVar534 >> 0xef;
      auVar110 = auVar534 >> 0xf7;
      bVar499 = auVar534[0x1f];
      auVar529 = auVar527 >> 7;
      auVar523 = auVar527 >> 0xf;
      auVar524 = auVar527 >> 0x17;
      auVar3 = auVar527 >> 0x1f;
      auVar7 = auVar527 >> 0x27;
      auVar11 = auVar527 >> 0x2f;
      auVar15 = auVar527 >> 0x37;
      auVar19 = auVar527 >> 0x3f;
      auVar23 = auVar527 >> 0x47;
      auVar27 = auVar527 >> 0x4f;
      auVar31 = auVar527 >> 0x57;
      auVar35 = auVar527 >> 0x5f;
      auVar39 = auVar527 >> 0x67;
      auVar43 = auVar527 >> 0x6f;
      auVar47 = auVar527 >> 0x77;
      auVar51 = auVar527 >> 0x7f;
      auVar55 = auVar527 >> 0x87;
      auVar59 = auVar527 >> 0x8f;
      auVar63 = auVar527 >> 0x97;
      auVar67 = auVar527 >> 0x9f;
      auVar71 = auVar527 >> 0xa7;
      auVar75 = auVar527 >> 0xaf;
      auVar79 = auVar527 >> 0xb7;
      auVar83 = auVar527 >> 0xbf;
      auVar87 = auVar527 >> 199;
      auVar91 = auVar527 >> 0xcf;
      auVar95 = auVar527 >> 0xd7;
      auVar99 = auVar527 >> 0xdf;
      auVar103 = auVar527 >> 0xe7;
      auVar107 = auVar527 >> 0xef;
      auVar111 = auVar527 >> 0xf7;
      bVar500 = auVar527[0x1f];
      auVar533 = vpaddb_avx2(auVar533,auVar533);
      auVar534 = vpaddb_avx2(auVar534,auVar534);
      auVar527 = vpaddb_avx2(auVar527,auVar527);
      auVar530 = auVar528 >> 7;
      auVar518 = auVar528 >> 0xf;
      auVar519 = auVar528 >> 0x17;
      auVar4 = auVar528 >> 0x1f;
      auVar8 = auVar528 >> 0x27;
      auVar12 = auVar528 >> 0x2f;
      auVar16 = auVar528 >> 0x37;
      auVar20 = auVar528 >> 0x3f;
      auVar24 = auVar528 >> 0x47;
      auVar28 = auVar528 >> 0x4f;
      auVar32 = auVar528 >> 0x57;
      auVar36 = auVar528 >> 0x5f;
      auVar40 = auVar528 >> 0x67;
      auVar44 = auVar528 >> 0x6f;
      auVar48 = auVar528 >> 0x77;
      auVar52 = auVar528 >> 0x7f;
      auVar56 = auVar528 >> 0x87;
      auVar60 = auVar528 >> 0x8f;
      auVar64 = auVar528 >> 0x97;
      auVar68 = auVar528 >> 0x9f;
      auVar72 = auVar528 >> 0xa7;
      auVar76 = auVar528 >> 0xaf;
      auVar80 = auVar528 >> 0xb7;
      auVar84 = auVar528 >> 0xbf;
      auVar88 = auVar528 >> 199;
      auVar92 = auVar528 >> 0xcf;
      auVar96 = auVar528 >> 0xd7;
      auVar100 = auVar528 >> 0xdf;
      auVar104 = auVar528 >> 0xe7;
      auVar108 = auVar528 >> 0xef;
      auVar112 = auVar528 >> 0xf7;
      bVar501 = auVar528[0x1f];
      auVar528 = vpaddb_avx2(auVar528,auVar528);
      *(int *)((long)flags + lVar517 + -4) =
           POPCOUNT((uint)(auVar529[0] & 1) | (uint)(auVar523[0] & 1) << 1 |
                    (uint)(auVar524[0] & 1) << 2 | (uint)(auVar3[0] & 1) << 3 |
                    (uint)(auVar7[0] & 1) << 4 | (uint)(auVar11[0] & 1) << 5 |
                    (uint)(auVar15[0] & 1) << 6 | (uint)(auVar19[0] & 1) << 7 |
                    (uint)(auVar23[0] & 1) << 8 | (uint)(auVar27[0] & 1) << 9 |
                    (uint)(auVar31[0] & 1) << 10 | (uint)(auVar35[0] & 1) << 0xb |
                    (uint)(auVar39[0] & 1) << 0xc | (uint)(auVar43[0] & 1) << 0xd |
                    (uint)(auVar47[0] & 1) << 0xe | (uint)auVar51[0] << 0xf |
                    (uint)(auVar55[0] & 1) << 0x10 | (uint)(auVar59[0] & 1) << 0x11 |
                    (uint)(auVar63[0] & 1) << 0x12 | (uint)(auVar67[0] & 1) << 0x13 |
                    (uint)(auVar71[0] & 1) << 0x14 | (uint)(auVar75[0] & 1) << 0x15 |
                    (uint)(auVar79[0] & 1) << 0x16 | (uint)auVar83[0] << 0x17 |
                    (uint)(auVar87[0] & 1) << 0x18 | (uint)(auVar91[0] & 1) << 0x19 |
                    (uint)(auVar95[0] & 1) << 0x1a | (uint)(auVar99[0] & 1) << 0x1b |
                    (uint)(auVar103[0] & 1) << 0x1c | (uint)(auVar107[0] & 1) << 0x1d |
                    (uint)(auVar111[0] & 1) << 0x1e | (uint)(bVar500 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar525[0] & 1) | (uint)(auVar531[0] & 1) << 1 |
                    (uint)(auVar521[0] & 1) << 2 | (uint)(auVar520[0] & 1) << 3 |
                    (uint)(auVar5[0] & 1) << 4 | (uint)(auVar9[0] & 1) << 5 |
                    (uint)(auVar13[0] & 1) << 6 | (uint)(auVar17[0] & 1) << 7 |
                    (uint)(auVar21[0] & 1) << 8 | (uint)(auVar25[0] & 1) << 9 |
                    (uint)(auVar29[0] & 1) << 10 | (uint)(auVar33[0] & 1) << 0xb |
                    (uint)(auVar37[0] & 1) << 0xc | (uint)(auVar41[0] & 1) << 0xd |
                    (uint)(auVar45[0] & 1) << 0xe | (uint)auVar49[0] << 0xf |
                    (uint)(auVar53[0] & 1) << 0x10 | (uint)(auVar57[0] & 1) << 0x11 |
                    (uint)(auVar61[0] & 1) << 0x12 | (uint)(auVar65[0] & 1) << 0x13 |
                    (uint)(auVar69[0] & 1) << 0x14 | (uint)(auVar73[0] & 1) << 0x15 |
                    (uint)(auVar77[0] & 1) << 0x16 | (uint)auVar81[0] << 0x17 |
                    (uint)(auVar85[0] & 1) << 0x18 | (uint)(auVar89[0] & 1) << 0x19 |
                    (uint)(auVar93[0] & 1) << 0x1a | (uint)(auVar97[0] & 1) << 0x1b |
                    (uint)(auVar101[0] & 1) << 0x1c | (uint)(auVar105[0] & 1) << 0x1d |
                    (uint)(auVar109[0] & 1) << 0x1e | (uint)(bVar498 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar517 + -4);
      *(int *)((long)flags + lVar517 + 0x1c) =
           POPCOUNT((uint)(auVar530[0] & 1) | (uint)(auVar518[0] & 1) << 1 |
                    (uint)(auVar519[0] & 1) << 2 | (uint)(auVar4[0] & 1) << 3 |
                    (uint)(auVar8[0] & 1) << 4 | (uint)(auVar12[0] & 1) << 5 |
                    (uint)(auVar16[0] & 1) << 6 | (uint)(auVar20[0] & 1) << 7 |
                    (uint)(auVar24[0] & 1) << 8 | (uint)(auVar28[0] & 1) << 9 |
                    (uint)(auVar32[0] & 1) << 10 | (uint)(auVar36[0] & 1) << 0xb |
                    (uint)(auVar40[0] & 1) << 0xc | (uint)(auVar44[0] & 1) << 0xd |
                    (uint)(auVar48[0] & 1) << 0xe | (uint)auVar52[0] << 0xf |
                    (uint)(auVar56[0] & 1) << 0x10 | (uint)(auVar60[0] & 1) << 0x11 |
                    (uint)(auVar64[0] & 1) << 0x12 | (uint)(auVar68[0] & 1) << 0x13 |
                    (uint)(auVar72[0] & 1) << 0x14 | (uint)(auVar76[0] & 1) << 0x15 |
                    (uint)(auVar80[0] & 1) << 0x16 | (uint)auVar84[0] << 0x17 |
                    (uint)(auVar88[0] & 1) << 0x18 | (uint)(auVar92[0] & 1) << 0x19 |
                    (uint)(auVar96[0] & 1) << 0x1a | (uint)(auVar100[0] & 1) << 0x1b |
                    (uint)(auVar104[0] & 1) << 0x1c | (uint)(auVar108[0] & 1) << 0x1d |
                    (uint)(auVar112[0] & 1) << 0x1e | (uint)(bVar501 >> 7) << 0x1f) +
           POPCOUNT((uint)(auVar526[0] & 1) | (uint)(auVar532[0] & 1) << 1 |
                    (uint)(auVar522[0] & 1) << 2 | (uint)(auVar2[0] & 1) << 3 |
                    (uint)(auVar6[0] & 1) << 4 | (uint)(auVar10[0] & 1) << 5 |
                    (uint)(auVar14[0] & 1) << 6 | (uint)(auVar18[0] & 1) << 7 |
                    (uint)(auVar22[0] & 1) << 8 | (uint)(auVar26[0] & 1) << 9 |
                    (uint)(auVar30[0] & 1) << 10 | (uint)(auVar34[0] & 1) << 0xb |
                    (uint)(auVar38[0] & 1) << 0xc | (uint)(auVar42[0] & 1) << 0xd |
                    (uint)(auVar46[0] & 1) << 0xe | (uint)auVar50[0] << 0xf |
                    (uint)(auVar54[0] & 1) << 0x10 | (uint)(auVar58[0] & 1) << 0x11 |
                    (uint)(auVar62[0] & 1) << 0x12 | (uint)(auVar66[0] & 1) << 0x13 |
                    (uint)(auVar70[0] & 1) << 0x14 | (uint)(auVar74[0] & 1) << 0x15 |
                    (uint)(auVar78[0] & 1) << 0x16 | (uint)auVar82[0] << 0x17 |
                    (uint)(auVar86[0] & 1) << 0x18 | (uint)(auVar90[0] & 1) << 0x19 |
                    (uint)(auVar94[0] & 1) << 0x1a | (uint)(auVar98[0] & 1) << 0x1b |
                    (uint)(auVar102[0] & 1) << 0x1c | (uint)(auVar106[0] & 1) << 0x1d |
                    (uint)(auVar110[0] & 1) << 0x1e | (uint)(bVar499 >> 7) << 0x1f) +
           *(int *)((long)flags + lVar517 + 0x1c);
      lVar517 = lVar517 + -4;
      auVar525 = _DAT_0011d0a0;
      auVar526 = _DAT_0011d0c0;
      uVar516 = uVar515;
    } while (lVar517 != 0);
  }
  while (uVar515 = uVar516 + 2, uVar515 <= uVar497) {
    lVar517 = 0x20;
    auVar535 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10),auVar525,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x10));
    auVar536 = vpermt2b_avx512vl(*(undefined1 (*) [32])(array + uVar516 * 0x10 + 0x10),auVar526,
                                 *(undefined1 (*) [32])(array + uVar516 * 0x10));
    do {
      auVar533 = auVar535 >> 7;
      auVar534 = auVar535 >> 0xf;
      auVar527 = auVar535 >> 0x17;
      auVar528 = auVar535 >> 0x1f;
      auVar529 = auVar535 >> 0x27;
      auVar530 = auVar535 >> 0x2f;
      auVar531 = auVar535 >> 0x37;
      auVar532 = auVar535 >> 0x3f;
      auVar523 = auVar535 >> 0x47;
      auVar518 = auVar535 >> 0x4f;
      auVar521 = auVar535 >> 0x57;
      auVar522 = auVar535 >> 0x5f;
      auVar524 = auVar535 >> 0x67;
      auVar519 = auVar535 >> 0x6f;
      auVar520 = auVar535 >> 0x77;
      auVar2 = auVar535 >> 0x7f;
      auVar3 = auVar535 >> 0x87;
      auVar4 = auVar535 >> 0x8f;
      auVar5 = auVar535 >> 0x97;
      auVar6 = auVar535 >> 0x9f;
      auVar7 = auVar535 >> 0xa7;
      auVar8 = auVar535 >> 0xaf;
      auVar9 = auVar535 >> 0xb7;
      auVar10 = auVar535 >> 0xbf;
      auVar11 = auVar535 >> 199;
      auVar12 = auVar535 >> 0xcf;
      auVar13 = auVar535 >> 0xd7;
      auVar14 = auVar535 >> 0xdf;
      auVar15 = auVar535 >> 0xe7;
      auVar16 = auVar535 >> 0xef;
      auVar17 = auVar535 >> 0xf7;
      bVar498 = auVar535[0x1f];
      auVar535 = vpaddb_avx2(auVar535,auVar535);
      piVar1 = (int *)((long)flags + lVar517 + -4);
      *piVar1 = *piVar1 + POPCOUNT((uint)(auVar533[0] & 1) | (uint)(auVar534[0] & 1) << 1 |
                                   (uint)(auVar527[0] & 1) << 2 | (uint)(auVar528[0] & 1) << 3 |
                                   (uint)(auVar529[0] & 1) << 4 | (uint)(auVar530[0] & 1) << 5 |
                                   (uint)(auVar531[0] & 1) << 6 | (uint)(auVar532[0] & 1) << 7 |
                                   (uint)(auVar523[0] & 1) << 8 | (uint)(auVar518[0] & 1) << 9 |
                                   (uint)(auVar521[0] & 1) << 10 | (uint)(auVar522[0] & 1) << 0xb |
                                   (uint)(auVar524[0] & 1) << 0xc | (uint)(auVar519[0] & 1) << 0xd |
                                   (uint)(auVar520[0] & 1) << 0xe | (uint)auVar2[0] << 0xf |
                                   (uint)(auVar3[0] & 1) << 0x10 | (uint)(auVar4[0] & 1) << 0x11 |
                                   (uint)(auVar5[0] & 1) << 0x12 | (uint)(auVar6[0] & 1) << 0x13 |
                                   (uint)(auVar7[0] & 1) << 0x14 | (uint)(auVar8[0] & 1) << 0x15 |
                                   (uint)(auVar9[0] & 1) << 0x16 | (uint)auVar10[0] << 0x17 |
                                   (uint)(auVar11[0] & 1) << 0x18 | (uint)(auVar12[0] & 1) << 0x19 |
                                   (uint)(auVar13[0] & 1) << 0x1a | (uint)(auVar14[0] & 1) << 0x1b |
                                   (uint)(auVar15[0] & 1) << 0x1c | (uint)(auVar16[0] & 1) << 0x1d |
                                   (uint)(auVar17[0] & 1) << 0x1e | (uint)(bVar498 >> 7) << 0x1f);
      auVar533 = auVar536 >> 7;
      auVar534 = auVar536 >> 0xf;
      auVar527 = auVar536 >> 0x17;
      auVar528 = auVar536 >> 0x1f;
      auVar529 = auVar536 >> 0x27;
      auVar530 = auVar536 >> 0x2f;
      auVar531 = auVar536 >> 0x37;
      auVar532 = auVar536 >> 0x3f;
      auVar523 = auVar536 >> 0x47;
      auVar518 = auVar536 >> 0x4f;
      auVar521 = auVar536 >> 0x57;
      auVar522 = auVar536 >> 0x5f;
      auVar524 = auVar536 >> 0x67;
      auVar519 = auVar536 >> 0x6f;
      auVar520 = auVar536 >> 0x77;
      auVar2 = auVar536 >> 0x7f;
      auVar3 = auVar536 >> 0x87;
      auVar4 = auVar536 >> 0x8f;
      auVar5 = auVar536 >> 0x97;
      auVar6 = auVar536 >> 0x9f;
      auVar7 = auVar536 >> 0xa7;
      auVar8 = auVar536 >> 0xaf;
      auVar9 = auVar536 >> 0xb7;
      auVar10 = auVar536 >> 0xbf;
      auVar11 = auVar536 >> 199;
      auVar12 = auVar536 >> 0xcf;
      auVar13 = auVar536 >> 0xd7;
      auVar14 = auVar536 >> 0xdf;
      auVar15 = auVar536 >> 0xe7;
      auVar16 = auVar536 >> 0xef;
      auVar17 = auVar536 >> 0xf7;
      bVar498 = auVar536[0x1f];
      auVar536 = vpaddb_avx2(auVar536,auVar536);
      piVar1 = (int *)((long)flags + lVar517 + 0x1c);
      *piVar1 = *piVar1 + POPCOUNT((uint)(auVar533[0] & 1) | (uint)(auVar534[0] & 1) << 1 |
                                   (uint)(auVar527[0] & 1) << 2 | (uint)(auVar528[0] & 1) << 3 |
                                   (uint)(auVar529[0] & 1) << 4 | (uint)(auVar530[0] & 1) << 5 |
                                   (uint)(auVar531[0] & 1) << 6 | (uint)(auVar532[0] & 1) << 7 |
                                   (uint)(auVar523[0] & 1) << 8 | (uint)(auVar518[0] & 1) << 9 |
                                   (uint)(auVar521[0] & 1) << 10 | (uint)(auVar522[0] & 1) << 0xb |
                                   (uint)(auVar524[0] & 1) << 0xc | (uint)(auVar519[0] & 1) << 0xd |
                                   (uint)(auVar520[0] & 1) << 0xe | (uint)auVar2[0] << 0xf |
                                   (uint)(auVar3[0] & 1) << 0x10 | (uint)(auVar4[0] & 1) << 0x11 |
                                   (uint)(auVar5[0] & 1) << 0x12 | (uint)(auVar6[0] & 1) << 0x13 |
                                   (uint)(auVar7[0] & 1) << 0x14 | (uint)(auVar8[0] & 1) << 0x15 |
                                   (uint)(auVar9[0] & 1) << 0x16 | (uint)auVar10[0] << 0x17 |
                                   (uint)(auVar11[0] & 1) << 0x18 | (uint)(auVar12[0] & 1) << 0x19 |
                                   (uint)(auVar13[0] & 1) << 0x1a | (uint)(auVar14[0] & 1) << 0x1b |
                                   (uint)(auVar15[0] & 1) << 0x1c | (uint)(auVar16[0] & 1) << 0x1d |
                                   (uint)(auVar17[0] & 1) << 0x1e | (uint)(bVar498 >> 7) << 0x1f);
      lVar517 = lVar517 + -4;
      uVar516 = uVar515;
    } while (lVar517 != 0);
  }
  uVar516 = uVar516 << 4;
  if (uVar516 < len) {
    auVar537 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar538 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar539 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      uVar516 = uVar516 + 1;
      auVar540 = vpbroadcastd_avx512f();
      auVar540 = vpsrlvd_avx512f(auVar540,auVar538);
      auVar540 = vpandd_avx512f(auVar540,auVar539);
      auVar537 = vpaddd_avx512f(auVar540,auVar537);
    } while (len != uVar516);
    auVar537 = vmovdqu64_avx512f(auVar537);
    *(undefined1 (*) [64])flags = auVar537;
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_blend_popcnt_unroll16(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m256i* data_vectors = (const __m256i*)(array);
    const uint32_t n_cycles = len / 16;

    size_t i = 0;
    for (/**/; i + 16 <= n_cycles; i += 16) {
#define L(p) __m256i v##p = _mm256_loadu_si256(data_vectors+i+p);
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

#define U0(p,k) __m256i input##p = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16(0x00FF)), _mm256_slli_epi16(v##k, 8));
#define U1(p,k) __m256i input##k = _mm256_or_si256(_mm256_and_si256(v##p, _mm256_set1_epi16((int16_t)0xFF00)), _mm256_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)
    U(0,1) U( 2, 3) U( 4, 5) U( 6, 7)
    U(8,9) U(10,11) U(12,13) U(14,15)

        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm256_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A( 2, 3) A( 4, 5) A( 6, 7)
            A(8,9) A(10,11) A(12,13) A(14,15)

#define P0(p) input##p = _mm256_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P( 2, 3) P( 4, 5) P( 6, 7)
            P(8,9) P(10,11) P(12,13) P(14,15)
        }
    }

    for (/**/; i + 8 <= n_cycles; i += 8) {
        L(0) L(1) L(2) L(3)
        L(4) L(5) L(6) L(7) 
        U(0,1) U(2, 3) U(4, 5) U(6, 7)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3) A( 4, 5) A( 6, 7)
            P(0,1) P( 2, 3) P( 4, 5) P( 6, 7)
        }
    }

    for (/**/; i + 4 <= n_cycles; i += 4) {
        L(0) L(1) L(2) L(3)
        U(0,1) U(2, 3)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1) A( 2, 3)
            P(0,1) P( 2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P

    i *= 16;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
    
    return 0;
}